

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  int iVar16;
  _func_int *p_Var17;
  int *piVar18;
  void *pvVar19;
  size_t sVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int iVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  undefined4 *puVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  long lVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  undefined1 (*pauVar49) [32];
  long lVar50;
  int iVar51;
  long lVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  long lVar55;
  undefined1 (*pauVar56) [16];
  uint uVar57;
  undefined1 (*pauVar58) [32];
  long lVar59;
  undefined1 (*pauVar60) [16];
  undefined1 auVar69 [16];
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar61 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined1 auVar78 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar85 [16];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar119 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [28];
  undefined1 auVar152 [32];
  undefined1 auVar178 [16];
  undefined1 auVar154 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar131 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar206 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar177;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar219 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar241 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  v4sf one;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [64];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [64];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [64];
  undefined1 auVar357 [16];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbec;
  undefined1 local_3b8 [16];
  size_t local_3a8;
  int local_3a0;
  Allocator *local_398;
  int local_390;
  int local_38c;
  undefined8 local_388;
  int local_380;
  size_t local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  float local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  ulong local_2d0;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [16];
  float local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined1 local_268 [16];
  float local_258;
  undefined1 local_248 [16];
  ulong local_230;
  ulong local_228;
  long local_220;
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar81 [32];
  float fVar84;
  undefined1 auVar105 [32];
  undefined1 auVar111 [32];
  float fVar120;
  undefined1 auVar153 [32];
  undefined1 auVar155 [32];
  
  local_390 = bottom_blob->dims;
  if (local_390 == 2) {
    iVar26 = *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_fma[-3]) /
             *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
    local_38c = bottom_blob->w;
    if (bottom_blob->w == iVar26) {
      local_38c = iVar26;
      if (1 < bottom_blob->elempack * bottom_blob->h) {
        Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]
                                     ),bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                    opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        p_Var17 = this->_vptr_InnerProduct_x86_fma[-3];
        innerproduct_gemm_fp16s_sse
                  (bottom_blob,top_blob,&this->weight_data_tm,
                   *(Mat **)(&this->field_0x178 + (long)p_Var17),
                   *(int *)(&this->field_0xe0 + (long)p_Var17),
                   (Mat *)(&this->field_0xe8 + (long)p_Var17),
                   (Option *)CONCAT44(in_stack_fffffffffffffbec,(uint)opt->use_packing_layout));
        return 0;
      }
    }
  }
  else {
    local_38c = bottom_blob->w;
  }
  piVar18 = bottom_blob->refcount;
  local_3b8._0_8_ = bottom_blob->data;
  local_3b8._8_8_ = bottom_blob->refcount;
  local_3a8 = bottom_blob->elemsize;
  local_3a0 = bottom_blob->elempack;
  local_398 = bottom_blob->allocator;
  local_388._0_4_ = bottom_blob->h;
  local_388._4_4_ = bottom_blob->d;
  local_380 = bottom_blob->c;
  local_378 = bottom_blob->cstep;
  iVar26 = local_390;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
    iVar26 = bottom_blob->dims;
  }
  if (iVar26 != 1) {
    auVar152[0] = opt->lightmode;
    auVar152._1_3_ = *(undefined3 *)&opt->field_0x1;
    auVar152._4_4_ = opt->num_threads;
    auVar152._8_8_ = opt->blob_allocator;
    uVar4 = opt->workspace_allocator;
    uVar5 = opt->openmp_blocktime;
    uVar6 = opt->use_winograd_convolution;
    uVar7 = opt->use_sgemm_convolution;
    uVar8 = opt->use_int8_inference;
    uVar9 = opt->use_vulkan_compute;
    auVar152[0x1f] = uVar9;
    auVar152[0x1e] = uVar8;
    auVar152[0x1d] = uVar7;
    auVar152[0x1c] = uVar6;
    auVar152._24_4_ = uVar5;
    auVar152._16_8_ = uVar4;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_1_ = opt->use_shader_pack8;
    uStack_50._1_1_ = opt->use_subgroup_basic;
    uStack_50._2_1_ = opt->use_subgroup_vote;
    uStack_50._3_1_ = opt->use_subgroup_ballot;
    uStack_50._4_1_ = opt->use_subgroup_shuffle;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_0;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_reserved_6;
    uStack_40._3_1_ = opt->use_reserved_7;
    uStack_40._4_1_ = opt->use_reserved_8;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar152._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar152._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_3b8);
  }
  uVar40 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_fma[-3]);
  lVar52 = 1;
  if (opt->use_packing_layout == true) {
    lVar52 = 8;
    if ((uVar40 & 7) != 0) {
      lVar52 = (ulong)((uVar40 & 3) == 0) * 3 + 1;
    }
  }
  iVar51 = (int)lVar52;
  Mat::create(top_blob,(int)uVar40 / iVar51,lVar52 * (local_3a8 / (ulong)(long)local_3a0),iVar51,
              opt->blob_allocator);
  iVar26 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (iVar51 == 1) {
      p_Var17 = this->_vptr_InnerProduct_x86_fma[-3];
      iVar51 = *(int *)(&this->field_0xe0 + (long)p_Var17);
      lVar52 = *(long *)(&this->field_0x178 + (long)p_Var17);
      uVar40 = local_3a0 * local_38c;
      iVar16 = top_blob->w;
      uVar31 = (ulong)iVar16;
      if (0 < iVar16 >> 3) {
        uVar34 = (ulong)(uint)(iVar16 >> 3);
        lVar38 = 1;
        lVar41 = 2;
        lVar45 = 3;
        lVar48 = 4;
        lVar50 = 5;
        lVar59 = 6;
        lVar54 = 7;
        lVar44 = 0;
        uVar29 = 0;
        local_230 = uVar34;
        do {
          local_2d0 = uVar29 * 8;
          auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar52 != 0) {
            auVar119 = ZEXT3264(*(undefined1 (*) [32])(lVar52 + uVar29 * 0x20));
          }
          auVar152 = auVar119._0_32_;
          lVar28 = (long)(this->weight_data_tm).w;
          pvVar19 = (this->weight_data_tm).data;
          sVar20 = (this->weight_data_tm).elemsize;
          lVar47 = local_3b8._0_8_;
          if ((int)uVar40 < 8) {
            lVar28 = sVar20 * lVar28;
            lVar32 = lVar28 * local_2d0;
            lVar33 = (local_2d0 | 1) * lVar28;
            lVar39 = (local_2d0 | 2) * lVar28;
            lVar42 = (local_2d0 | 3) * lVar28;
            lVar43 = (local_2d0 | 4) * lVar28;
            lVar46 = (local_2d0 | 5) * lVar28;
            lVar36 = (local_2d0 | 6) * lVar28;
            lVar28 = lVar28 * (local_2d0 | 7);
            uVar27 = 0;
            local_118 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_b8 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar32 = sVar20 * lVar44 * lVar28;
            lVar33 = sVar20 * lVar38 * lVar28;
            lVar39 = sVar20 * lVar41 * lVar28;
            lVar42 = sVar20 * lVar45 * lVar28;
            lVar43 = sVar20 * lVar48 * lVar28;
            lVar46 = sVar20 * lVar50 * lVar28;
            lVar36 = sVar20 * lVar59 * lVar28;
            lVar28 = sVar20 * lVar54 * lVar28;
            local_2c8._0_8_ = pvVar19;
            auVar210 = ZEXT864(0);
            auVar312 = ZEXT864(0);
            auVar176 = ZEXT864(0);
            auVar376 = ZEXT864(0);
            auVar356 = ZEXT864(0);
            auVar349 = ZEXT864(0);
            auVar341 = ZEXT864(0);
            auVar258 = ZEXT864(0);
            iVar26 = 7;
            lVar55 = 0;
            do {
              auVar80 = *(undefined1 (*) [32])(local_3b8._0_8_ + lVar55 * 2);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar32));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar258._0_32_,auVar80,auVar108);
              auVar258 = ZEXT1664(auVar122);
              local_118 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar33));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar341._0_32_,auVar80,auVar108);
              auVar341 = ZEXT1664(auVar122);
              local_178 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar39));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar349._0_32_,auVar80,auVar108);
              auVar349 = ZEXT1664(auVar122);
              local_138 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar42));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar356._0_32_,auVar80,auVar108);
              auVar356 = ZEXT1664(auVar122);
              local_158 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar43));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar376._0_32_,auVar80,auVar108);
              auVar376 = ZEXT1664(auVar122);
              local_d8 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar46));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar176._0_32_,auVar80,auVar108);
              auVar176 = ZEXT1664(auVar122);
              local_f8 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar36));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar312._0_32_,auVar80,auVar108);
              auVar312 = ZEXT1664(auVar122);
              local_b8 = ZEXT1632(auVar122);
              auVar122 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar19 + lVar55 + lVar28));
              auVar108 = vcvtph2ps_f16c(auVar122);
              auVar122 = vfmadd231ps_fma(auVar210._0_32_,auVar80,auVar108);
              auVar210 = ZEXT1664(auVar122);
              local_98 = ZEXT1632(auVar122);
              lVar47 = lVar47 + 0x20;
              lVar55 = lVar55 + 0x10;
              iVar26 = iVar26 + 8;
            } while (iVar26 < (int)uVar40);
            lVar32 = lVar32 + lVar55;
            lVar33 = lVar33 + lVar55;
            lVar39 = lVar39 + lVar55;
            lVar42 = lVar42 + lVar55;
            lVar43 = lVar43 + lVar55;
            lVar46 = lVar46 + lVar55;
            lVar36 = lVar36 + lVar55;
            lVar28 = lVar28 + lVar55;
            uVar34 = local_230;
            uVar27 = uVar40 & 0xfffffff8;
          }
          local_348._0_8_ = (long)pvVar19 + lVar32;
          local_358._0_8_ = (long)pvVar19 + lVar33;
          local_368._0_8_ = (long)pvVar19 + lVar39;
          local_308 = lVar54;
          local_300 = lVar59;
          local_2f8 = lVar50;
          local_2f0 = lVar48;
          local_2e8 = lVar45;
          local_2e0 = lVar41;
          local_2d8 = lVar38;
          local_228 = uVar29;
          local_220 = lVar44;
          if ((int)uVar27 < (int)uVar40) {
            lVar44 = 0;
            do {
              local_2c8 = auVar119._0_32_;
              local_318 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              fVar84 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar44 * 2));
              auVar152 = local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar84;
              local_218._8_4_ = extraout_XMM0_Dc;
              local_218._16_16_ = auVar152._16_16_;
              local_218._12_4_ = extraout_XMM0_Dd;
              local_328 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              local_338 = float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar44 * 2));
              local_248 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              local_258 = float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar44 * 2));
              local_268 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              fVar84 = float16_to_float32(*(unsigned_short *)((long)pvVar19 + lVar44 * 2 + lVar42));
              local_278 = CONCAT44(extraout_XMM0_Db_00,fVar84);
              local_288 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              local_298 = float16_to_float32(*(unsigned_short *)
                                              ((long)pvVar19 + lVar44 * 2 + lVar43));
              local_198._0_16_ = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              uStack_294 = extraout_XMM0_Db_01;
              uStack_290 = extraout_XMM0_Dc_00;
              uStack_28c = extraout_XMM0_Dd_00;
              fVar84 = float16_to_float32(*(unsigned_short *)((long)pvVar19 + lVar44 * 2 + lVar46));
              auVar152 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_02;
              local_1b8._0_4_ = fVar84;
              local_1b8._8_4_ = extraout_XMM0_Dc_01;
              local_1b8._16_16_ = auVar152._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_01;
              local_1d8._0_16_ = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              fVar84 = float16_to_float32(*(unsigned_short *)((long)pvVar19 + lVar44 * 2 + lVar36));
              auVar152 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_03;
              local_1f8._0_4_ = fVar84;
              local_1f8._8_4_ = extraout_XMM0_Dc_02;
              local_1f8._16_16_ = auVar152._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_02;
              local_2a8 = ZEXT416(*(uint *)(lVar47 + lVar44 * 4));
              auVar119._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar19 + lVar44 * 2 + lVar28));
              auVar119._4_60_ = extraout_var;
              auVar122._4_4_ = uStack_294;
              auVar122._0_4_ = local_298;
              auVar122._8_4_ = uStack_290;
              auVar122._12_4_ = uStack_28c;
              auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar122 = vinsertps_avx(auVar122,auVar119._0_16_,0x30);
              auVar178 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_338),0x10);
              auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_258),0x20);
              auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_278),0x30);
              auVar80._16_16_ = auVar122;
              auVar80._0_16_ = auVar178;
              auVar122 = vinsertps_avx(local_288,ZEXT416((uint)local_198._0_4_),0x10);
              auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)local_2a8._0_4_),0x30);
              auVar178 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
              auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_248._0_4_),0x20);
              auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_268._0_4_),0x30);
              auVar108._16_16_ = auVar122;
              auVar108._0_16_ = auVar178;
              auVar122 = vfmadd231ps_fma(local_2c8,auVar80,auVar108);
              auVar119 = ZEXT1664(auVar122);
              auVar152 = ZEXT1632(auVar122);
              lVar44 = lVar44 + 1;
            } while (uVar40 - uVar27 != (int)lVar44);
          }
          auVar80 = vhaddps_avx(local_118,local_178);
          auVar108 = vhaddps_avx(local_138,local_158);
          auVar108 = vhaddps_avx(auVar80,auVar108);
          auVar80 = vhaddps_avx(local_d8,local_f8);
          auVar78 = vhaddps_avx(local_b8,local_98);
          auVar78 = vhaddps_avx(auVar80,auVar78);
          auVar80 = vblendps_avx(auVar108,auVar78,0xf0);
          auVar108 = vperm2f128_avx(auVar108,auVar78,0x21);
          fVar84 = auVar108._0_4_ + auVar152._0_4_ + auVar80._0_4_;
          fVar120 = auVar108._4_4_ + auVar152._4_4_ + auVar80._4_4_;
          auVar78._0_8_ = CONCAT44(fVar120,fVar84);
          auVar78._8_4_ = auVar108._8_4_ + auVar152._8_4_ + auVar80._8_4_;
          auVar78._12_4_ = auVar108._12_4_ + auVar152._12_4_ + auVar80._12_4_;
          auVar78._16_4_ = auVar108._16_4_ + auVar152._16_4_ + auVar80._16_4_;
          auVar78._20_4_ = auVar108._20_4_ + auVar152._20_4_ + auVar80._20_4_;
          auVar78._24_4_ = auVar108._24_4_ + auVar152._24_4_ + auVar80._24_4_;
          auVar78._28_4_ = auVar108._28_4_ + auVar152._28_4_ + auVar80._28_4_;
          switch(iVar51) {
          case 1:
            auVar78 = vmaxps_avx(auVar78,_DAT_005191a0);
            break;
          case 2:
            auVar152 = vmaxps_avx(auVar78,ZEXT832(0) << 0x20);
            auVar80 = vminps_avx(auVar78,ZEXT832(0) << 0x20);
            uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
            auVar83._4_4_ = uVar15;
            auVar83._0_4_ = uVar15;
            auVar83._8_4_ = uVar15;
            auVar83._12_4_ = uVar15;
            auVar83._16_4_ = uVar15;
            auVar83._20_4_ = uVar15;
            auVar83._24_4_ = uVar15;
            auVar83._28_4_ = uVar15;
            auVar122 = vfmadd213ps_fma(auVar83,auVar80,auVar152);
            auVar78 = ZEXT1632(auVar122);
            break;
          case 3:
            uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
            auVar113._4_4_ = uVar15;
            auVar113._0_4_ = uVar15;
            auVar113._8_4_ = uVar15;
            auVar113._12_4_ = uVar15;
            auVar113._16_4_ = uVar15;
            auVar113._20_4_ = uVar15;
            auVar113._24_4_ = uVar15;
            auVar113._28_4_ = uVar15;
            uVar15 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
            auVar171._4_4_ = uVar15;
            auVar171._0_4_ = uVar15;
            auVar171._8_4_ = uVar15;
            auVar171._12_4_ = uVar15;
            auVar171._16_4_ = uVar15;
            auVar171._20_4_ = uVar15;
            auVar171._24_4_ = uVar15;
            auVar171._28_4_ = uVar15;
            auVar152 = vmaxps_avx(auVar78,auVar113);
            auVar78 = vminps_avx(auVar152,auVar171);
            break;
          case 4:
            auVar79._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar79._8_4_ = -auVar78._8_4_;
            auVar79._12_4_ = -auVar78._12_4_;
            auVar79._16_4_ = -auVar78._16_4_;
            auVar79._20_4_ = -auVar78._20_4_;
            auVar79._24_4_ = -auVar78._24_4_;
            auVar79._28_4_ = -auVar78._28_4_;
            auVar114._8_4_ = 0x42b0c0a5;
            auVar114._0_8_ = 0x42b0c0a542b0c0a5;
            auVar114._12_4_ = 0x42b0c0a5;
            auVar114._16_4_ = 0x42b0c0a5;
            auVar114._20_4_ = 0x42b0c0a5;
            auVar114._24_4_ = 0x42b0c0a5;
            auVar114._28_4_ = 0x42b0c0a5;
            auVar152 = vminps_avx(auVar79,auVar114);
            auVar115._8_4_ = 0xc2b0c0a5;
            auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar115._12_4_ = 0xc2b0c0a5;
            auVar115._16_4_ = 0xc2b0c0a5;
            auVar115._20_4_ = 0xc2b0c0a5;
            auVar115._24_4_ = 0xc2b0c0a5;
            auVar115._28_4_ = 0xc2b0c0a5;
            auVar80 = vmaxps_avx(auVar152,auVar115);
            auVar116._8_4_ = 0x3fb8aa3b;
            auVar116._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar116._12_4_ = 0x3fb8aa3b;
            auVar116._16_4_ = 0x3fb8aa3b;
            auVar116._20_4_ = 0x3fb8aa3b;
            auVar116._24_4_ = 0x3fb8aa3b;
            auVar116._28_4_ = 0x3fb8aa3b;
            auVar239._8_4_ = 0x3f000000;
            auVar239._0_8_ = 0x3f0000003f000000;
            auVar239._12_4_ = 0x3f000000;
            auVar239._16_4_ = 0x3f000000;
            auVar239._20_4_ = 0x3f000000;
            auVar239._24_4_ = 0x3f000000;
            auVar239._28_4_ = 0x3f000000;
            auVar122 = vfmadd213ps_fma(auVar116,auVar80,auVar239);
            auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
            auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
            auVar257._8_4_ = 0x3f800000;
            auVar257._0_8_ = 0x3f8000003f800000;
            auVar257._12_4_ = 0x3f800000;
            auVar257._16_4_ = 0x3f800000;
            auVar257._20_4_ = 0x3f800000;
            auVar257._24_4_ = 0x3f800000;
            auVar257._28_4_ = 0x3f800000;
            auVar152 = vandps_avx(auVar152,auVar257);
            auVar152 = vsubps_avx(auVar108,auVar152);
            auVar172._8_4_ = 0x3f318000;
            auVar172._0_8_ = 0x3f3180003f318000;
            auVar172._12_4_ = 0x3f318000;
            auVar172._16_4_ = 0x3f318000;
            auVar172._20_4_ = 0x3f318000;
            auVar172._24_4_ = 0x3f318000;
            auVar172._28_4_ = 0x3f318000;
            auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar172);
            auVar173._8_4_ = 0x395e8083;
            auVar173._0_8_ = 0x395e8083395e8083;
            auVar173._12_4_ = 0x395e8083;
            auVar173._16_4_ = 0x395e8083;
            auVar173._20_4_ = 0x395e8083;
            auVar173._24_4_ = 0x395e8083;
            auVar173._28_4_ = 0x395e8083;
            auVar178 = vfmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar173);
            auVar80 = ZEXT1632(auVar178);
            auVar25._28_4_ = 0x395e8083;
            auVar25._0_28_ =
                 ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                    CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                             CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                      auVar178._0_4_ * auVar178._0_4_))));
            auVar209._8_4_ = 0x39506967;
            auVar209._0_8_ = 0x3950696739506967;
            auVar209._12_4_ = 0x39506967;
            auVar209._16_4_ = 0x39506967;
            auVar209._20_4_ = 0x39506967;
            auVar209._24_4_ = 0x39506967;
            auVar209._28_4_ = 0x39506967;
            auVar275._8_4_ = 0x3ab743ce;
            auVar275._0_8_ = 0x3ab743ce3ab743ce;
            auVar275._12_4_ = 0x3ab743ce;
            auVar275._16_4_ = 0x3ab743ce;
            auVar275._20_4_ = 0x3ab743ce;
            auVar275._24_4_ = 0x3ab743ce;
            auVar275._28_4_ = 0x3ab743ce;
            auVar122 = vfmadd213ps_fma(auVar209,auVar80,auVar275);
            auVar276._8_4_ = 0x3c088908;
            auVar276._0_8_ = 0x3c0889083c088908;
            auVar276._12_4_ = 0x3c088908;
            auVar276._16_4_ = 0x3c088908;
            auVar276._20_4_ = 0x3c088908;
            auVar276._24_4_ = 0x3c088908;
            auVar276._28_4_ = 0x3c088908;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar276);
            auVar277._8_4_ = 0x3d2aa9c1;
            auVar277._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar277._12_4_ = 0x3d2aa9c1;
            auVar277._16_4_ = 0x3d2aa9c1;
            auVar277._20_4_ = 0x3d2aa9c1;
            auVar277._24_4_ = 0x3d2aa9c1;
            auVar277._28_4_ = 0x3d2aa9c1;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar277);
            auVar278._8_4_ = 0x3e2aaaaa;
            auVar278._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar278._12_4_ = 0x3e2aaaaa;
            auVar278._16_4_ = 0x3e2aaaaa;
            auVar278._20_4_ = 0x3e2aaaaa;
            auVar278._24_4_ = 0x3e2aaaaa;
            auVar278._28_4_ = 0x3e2aaaaa;
            auVar80 = ZEXT1632(auVar178);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar278);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar239);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar25,auVar80);
            auVar69._0_4_ = (int)auVar152._0_4_;
            auVar69._4_4_ = (int)auVar152._4_4_;
            auVar69._8_4_ = (int)auVar152._8_4_;
            auVar69._12_4_ = (int)auVar152._12_4_;
            auVar81._16_4_ = (int)auVar152._16_4_;
            auVar81._0_16_ = auVar69;
            auVar81._20_4_ = (int)auVar152._20_4_;
            auVar81._24_4_ = (int)auVar152._24_4_;
            auVar81._28_4_ = (int)auVar152._28_4_;
            auVar178 = vpslld_avx(auVar69,0x17);
            auVar122 = vpslld_avx(auVar81._16_16_,0x17);
            auVar131._8_4_ = 0x3f800000;
            auVar131._0_8_ = 0x3f8000003f800000;
            auVar131._12_4_ = 0x3f800000;
            auVar122 = vpaddd_avx(auVar122,auVar131);
            auVar178 = vpaddd_avx(auVar178,auVar131);
            auVar82._16_16_ = auVar122;
            auVar82._0_16_ = auVar178;
            auVar117._0_4_ = auVar214._0_4_ + 1.0;
            auVar117._4_4_ = auVar214._4_4_ + 1.0;
            auVar117._8_4_ = auVar214._8_4_ + 1.0;
            auVar117._12_4_ = auVar214._12_4_ + 1.0;
            auVar117._16_4_ = 0x3f800000;
            auVar117._20_4_ = 0x3f800000;
            auVar117._24_4_ = 0x3f800000;
            auVar117._28_4_ = 0x3f800000;
            auVar122 = vfmadd213ps_fma(auVar82,auVar117,auVar257);
            auVar152 = vrcpps_avx(ZEXT1632(auVar122));
            auVar122 = vfmsub213ps_fma(ZEXT1632(auVar122),auVar152,auVar257);
            auVar122 = vfnmadd132ps_fma(ZEXT1632(auVar122),auVar152,auVar152);
            auVar78 = ZEXT1632(auVar122);
            break;
          case 5:
            auVar289._8_4_ = 0x42b0c0a5;
            auVar289._0_8_ = 0x42b0c0a542b0c0a5;
            auVar289._12_4_ = 0x42b0c0a5;
            auVar289._16_4_ = 0x42b0c0a5;
            auVar289._20_4_ = 0x42b0c0a5;
            auVar289._24_4_ = 0x42b0c0a5;
            auVar289._28_4_ = 0x42b0c0a5;
            auVar152 = vminps_avx(auVar78,auVar289);
            auVar297._8_4_ = 0xc2b0c0a5;
            auVar297._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar297._12_4_ = 0xc2b0c0a5;
            auVar297._16_4_ = 0xc2b0c0a5;
            auVar297._20_4_ = 0xc2b0c0a5;
            auVar297._24_4_ = 0xc2b0c0a5;
            auVar297._28_4_ = 0xc2b0c0a5;
            auVar80 = vmaxps_avx(auVar297,auVar152);
            auVar163._8_4_ = 0x3fb8aa3b;
            auVar163._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar163._12_4_ = 0x3fb8aa3b;
            auVar163._16_4_ = 0x3fb8aa3b;
            auVar163._20_4_ = 0x3fb8aa3b;
            auVar163._24_4_ = 0x3fb8aa3b;
            auVar163._28_4_ = 0x3fb8aa3b;
            auVar311._8_4_ = 0x3f000000;
            auVar311._0_8_ = 0x3f0000003f000000;
            auVar311._12_4_ = 0x3f000000;
            auVar311._16_4_ = 0x3f000000;
            auVar311._20_4_ = 0x3f000000;
            auVar311._24_4_ = 0x3f000000;
            auVar311._28_4_ = 0x3f000000;
            auVar122 = vfmadd213ps_fma(auVar163,auVar80,auVar311);
            auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
            auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
            auVar348._8_4_ = 0x3f800000;
            auVar348._0_8_ = 0x3f8000003f800000;
            auVar348._12_4_ = 0x3f800000;
            auVar348._16_4_ = 0x3f800000;
            auVar348._20_4_ = 0x3f800000;
            auVar348._24_4_ = 0x3f800000;
            auVar348._28_4_ = 0x3f800000;
            auVar152 = vandps_avx(auVar348,auVar152);
            auVar152 = vsubps_avx(auVar108,auVar152);
            auVar355._8_4_ = 0x3f318000;
            auVar355._0_8_ = 0x3f3180003f318000;
            auVar355._12_4_ = 0x3f318000;
            auVar355._16_4_ = 0x3f318000;
            auVar355._20_4_ = 0x3f318000;
            auVar355._24_4_ = 0x3f318000;
            auVar355._28_4_ = 0x3f318000;
            auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar355);
            auVar298._8_4_ = 0xb95e8083;
            auVar298._0_8_ = 0xb95e8083b95e8083;
            auVar298._12_4_ = 0xb95e8083;
            auVar298._16_4_ = 0xb95e8083;
            auVar298._20_4_ = 0xb95e8083;
            auVar298._24_4_ = 0xb95e8083;
            auVar298._28_4_ = 0xb95e8083;
            auVar178 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar298);
            auVar80 = ZEXT1632(auVar178);
            auVar102._28_4_ = auVar108._28_4_;
            auVar102._0_28_ =
                 ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                    CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                             CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                      auVar178._0_4_ * auVar178._0_4_))));
            auVar368._8_4_ = 0x39506967;
            auVar368._0_8_ = 0x3950696739506967;
            auVar368._12_4_ = 0x39506967;
            auVar368._16_4_ = 0x39506967;
            auVar368._20_4_ = 0x39506967;
            auVar368._24_4_ = 0x39506967;
            auVar368._28_4_ = 0x39506967;
            auVar360._8_4_ = 0x3ab743ce;
            auVar360._0_8_ = 0x3ab743ce3ab743ce;
            auVar360._12_4_ = 0x3ab743ce;
            auVar360._16_4_ = 0x3ab743ce;
            auVar360._20_4_ = 0x3ab743ce;
            auVar360._24_4_ = 0x3ab743ce;
            auVar360._28_4_ = 0x3ab743ce;
            auVar122 = vfmadd213ps_fma(auVar368,auVar80,auVar360);
            auVar375._8_4_ = 0x3c088908;
            auVar375._0_8_ = 0x3c0889083c088908;
            auVar375._12_4_ = 0x3c088908;
            auVar375._16_4_ = 0x3c088908;
            auVar375._20_4_ = 0x3c088908;
            auVar375._24_4_ = 0x3c088908;
            auVar375._28_4_ = 0x3c088908;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar375);
            auVar250._8_4_ = 0x3d2aa9c1;
            auVar250._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar250._12_4_ = 0x3d2aa9c1;
            auVar250._16_4_ = 0x3d2aa9c1;
            auVar250._20_4_ = 0x3d2aa9c1;
            auVar250._24_4_ = 0x3d2aa9c1;
            auVar250._28_4_ = 0x3d2aa9c1;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar250);
            auVar251._8_4_ = 0x3e2aaaaa;
            auVar251._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar251._12_4_ = 0x3e2aaaaa;
            auVar251._16_4_ = 0x3e2aaaaa;
            auVar251._20_4_ = 0x3e2aaaaa;
            auVar251._24_4_ = 0x3e2aaaaa;
            auVar251._28_4_ = 0x3e2aaaaa;
            auVar80 = ZEXT1632(auVar178);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar251);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar311);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar102,auVar80);
            auVar206._0_4_ = auVar122._0_4_ + 1.0;
            auVar206._4_4_ = auVar122._4_4_ + 1.0;
            auVar206._8_4_ = auVar122._8_4_ + 1.0;
            auVar206._12_4_ = auVar122._12_4_ + 1.0;
            auVar206._16_4_ = 0x3f800000;
            auVar206._20_4_ = 0x3f800000;
            auVar206._24_4_ = 0x3f800000;
            auVar206._28_4_ = 0x3f800000;
            auVar178._0_4_ = (int)auVar152._0_4_;
            auVar178._4_4_ = (int)auVar152._4_4_;
            auVar178._8_4_ = (int)auVar152._8_4_;
            auVar178._12_4_ = (int)auVar152._12_4_;
            auVar109._16_4_ = (int)auVar152._16_4_;
            auVar109._0_16_ = auVar178;
            auVar109._20_4_ = (int)auVar152._20_4_;
            auVar109._24_4_ = (int)auVar152._24_4_;
            auVar109._28_4_ = (int)auVar152._28_4_;
            auVar178 = vpslld_avx(auVar178,0x17);
            auVar122 = vpslld_avx(auVar109._16_16_,0x17);
            auVar281._8_4_ = 0x3f800000;
            auVar281._0_8_ = 0x3f8000003f800000;
            auVar281._12_4_ = 0x3f800000;
            auVar122 = vpaddd_avx(auVar122,auVar281);
            auVar178 = vpaddd_avx(auVar178,auVar281);
            auVar110._16_16_ = auVar122;
            auVar110._0_16_ = auVar178;
            auVar214 = vfmadd213ps_fma(auVar110,auVar206,auVar348);
            auVar164._8_4_ = 0x800000;
            auVar164._0_8_ = 0x80000000800000;
            auVar164._12_4_ = 0x800000;
            auVar164._16_4_ = 0x800000;
            auVar164._20_4_ = 0x800000;
            auVar164._24_4_ = 0x800000;
            auVar164._28_4_ = 0x800000;
            auVar152 = vmaxps_avx(ZEXT1632(auVar214),auVar164);
            auVar178 = vpsrld_avx(auVar152._0_16_,0x17);
            auVar122 = vpsrld_avx(auVar152._16_16_,0x17);
            auVar252._8_4_ = 0x807fffff;
            auVar252._0_8_ = 0x807fffff807fffff;
            auVar252._12_4_ = 0x807fffff;
            auVar252._16_4_ = 0x807fffff;
            auVar252._20_4_ = 0x807fffff;
            auVar252._24_4_ = 0x807fffff;
            auVar252._28_4_ = 0x807fffff;
            auVar152 = vandps_avx(auVar152,auVar252);
            auVar108 = vorps_avx(auVar311,auVar152);
            auVar253._8_4_ = 0x3f3504f3;
            auVar253._0_8_ = 0x3f3504f33f3504f3;
            auVar253._12_4_ = 0x3f3504f3;
            auVar253._16_4_ = 0x3f3504f3;
            auVar253._20_4_ = 0x3f3504f3;
            auVar253._24_4_ = 0x3f3504f3;
            auVar253._28_4_ = 0x3f3504f3;
            auVar80 = vcmpps_avx(auVar253,auVar108,2);
            auVar152 = vandnps_avx(auVar80,auVar108);
            auVar340._8_4_ = 0xbf800000;
            auVar340._0_8_ = 0xbf800000bf800000;
            auVar340._12_4_ = 0xbf800000;
            auVar340._16_4_ = 0xbf800000;
            auVar340._20_4_ = 0xbf800000;
            auVar340._24_4_ = 0xbf800000;
            auVar340._28_4_ = 0xbf800000;
            auVar165._0_4_ = auVar108._0_4_ + -1.0 + auVar152._0_4_;
            auVar165._4_4_ = auVar108._4_4_ + -1.0 + auVar152._4_4_;
            auVar165._8_4_ = auVar108._8_4_ + -1.0 + auVar152._8_4_;
            auVar165._12_4_ = auVar108._12_4_ + -1.0 + auVar152._12_4_;
            auVar165._16_4_ = auVar108._16_4_ + -1.0 + auVar152._16_4_;
            auVar165._20_4_ = auVar108._20_4_ + -1.0 + auVar152._20_4_;
            auVar165._24_4_ = auVar108._24_4_ + -1.0 + auVar152._24_4_;
            auVar165._28_4_ = auVar108._28_4_ + -1.0 + auVar152._28_4_;
            auVar122 = vpsubd_avx(auVar122,auVar80._16_16_);
            auVar260._8_4_ = 0xffffff81;
            auVar260._0_8_ = 0xffffff81ffffff81;
            auVar260._12_4_ = 0xffffff81;
            auVar122 = vpaddd_avx(auVar122,auVar260);
            auVar178 = vpsubd_avx(auVar178,auVar80._0_16_);
            auVar178 = vpaddd_avx(auVar178,auVar260);
            auVar207._16_16_ = auVar122;
            auVar207._0_16_ = auVar178;
            auVar238._0_4_ = auVar165._0_4_ * auVar165._0_4_;
            auVar238._4_4_ = auVar165._4_4_ * auVar165._4_4_;
            auVar238._8_4_ = auVar165._8_4_ * auVar165._8_4_;
            auVar238._12_4_ = auVar165._12_4_ * auVar165._12_4_;
            auVar238._16_4_ = auVar165._16_4_ * auVar165._16_4_;
            auVar238._20_4_ = auVar165._20_4_ * auVar165._20_4_;
            auVar238._24_4_ = auVar165._24_4_ * auVar165._24_4_;
            auVar238._28_4_ = 0;
            auVar254._8_4_ = 0x3d9021bb;
            auVar254._0_8_ = 0x3d9021bb3d9021bb;
            auVar254._12_4_ = 0x3d9021bb;
            auVar254._16_4_ = 0x3d9021bb;
            auVar254._20_4_ = 0x3d9021bb;
            auVar254._24_4_ = 0x3d9021bb;
            auVar254._28_4_ = 0x3d9021bb;
            auVar265._8_4_ = 0xbdebd1b8;
            auVar265._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar265._12_4_ = 0xbdebd1b8;
            auVar265._16_4_ = 0xbdebd1b8;
            auVar265._20_4_ = 0xbdebd1b8;
            auVar265._24_4_ = 0xbdebd1b8;
            auVar265._28_4_ = 0xbdebd1b8;
            auVar122 = vfmadd213ps_fma(auVar254,auVar165,auVar265);
            auVar266._8_4_ = 0x3def251a;
            auVar266._0_8_ = 0x3def251a3def251a;
            auVar266._12_4_ = 0x3def251a;
            auVar266._16_4_ = 0x3def251a;
            auVar266._20_4_ = 0x3def251a;
            auVar266._24_4_ = 0x3def251a;
            auVar266._28_4_ = 0x3def251a;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar266);
            auVar267._8_4_ = 0xbdfe5d4f;
            auVar267._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar267._12_4_ = 0xbdfe5d4f;
            auVar267._16_4_ = 0xbdfe5d4f;
            auVar267._20_4_ = 0xbdfe5d4f;
            auVar267._24_4_ = 0xbdfe5d4f;
            auVar267._28_4_ = 0xbdfe5d4f;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar267);
            auVar268._8_4_ = 0x3e11e9bf;
            auVar268._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar268._12_4_ = 0x3e11e9bf;
            auVar268._16_4_ = 0x3e11e9bf;
            auVar268._20_4_ = 0x3e11e9bf;
            auVar268._24_4_ = 0x3e11e9bf;
            auVar268._28_4_ = 0x3e11e9bf;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar268);
            auVar269._8_4_ = 0xbe2aae50;
            auVar269._0_8_ = 0xbe2aae50be2aae50;
            auVar269._12_4_ = 0xbe2aae50;
            auVar269._16_4_ = 0xbe2aae50;
            auVar269._20_4_ = 0xbe2aae50;
            auVar269._24_4_ = 0xbe2aae50;
            auVar269._28_4_ = 0xbe2aae50;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar269);
            auVar270._8_4_ = 0x3e4cceac;
            auVar270._0_8_ = 0x3e4cceac3e4cceac;
            auVar270._12_4_ = 0x3e4cceac;
            auVar270._16_4_ = 0x3e4cceac;
            auVar270._20_4_ = 0x3e4cceac;
            auVar270._24_4_ = 0x3e4cceac;
            auVar270._28_4_ = 0x3e4cceac;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar270);
            auVar271._8_4_ = 0xbe7ffffc;
            auVar271._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar271._12_4_ = 0xbe7ffffc;
            auVar271._16_4_ = 0xbe7ffffc;
            auVar271._20_4_ = 0xbe7ffffc;
            auVar271._24_4_ = 0xbe7ffffc;
            auVar271._28_4_ = 0xbe7ffffc;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar271);
            auVar272._8_4_ = 0x3eaaaaaa;
            auVar272._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar272._12_4_ = 0x3eaaaaaa;
            auVar272._16_4_ = 0x3eaaaaaa;
            auVar272._20_4_ = 0x3eaaaaaa;
            auVar272._24_4_ = 0x3eaaaaaa;
            auVar272._28_4_ = 0x3eaaaaaa;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar165,auVar272);
            auVar255._0_4_ = auVar238._0_4_ * auVar165._0_4_ * auVar122._0_4_;
            auVar255._4_4_ = auVar238._4_4_ * auVar165._4_4_ * auVar122._4_4_;
            auVar255._8_4_ = auVar238._8_4_ * auVar165._8_4_ * auVar122._8_4_;
            auVar255._12_4_ = auVar238._12_4_ * auVar165._12_4_ * auVar122._12_4_;
            auVar255._16_4_ = auVar238._16_4_ * auVar165._16_4_ * 0.0;
            auVar255._20_4_ = auVar238._20_4_ * auVar165._20_4_ * 0.0;
            auVar255._24_4_ = auVar238._24_4_ * auVar165._24_4_ * 0.0;
            auVar255._28_4_ = 0;
            auVar80 = vcvtdq2ps_avx(auVar207);
            auVar122 = vfmadd231ps_fma(auVar255,auVar80,auVar298);
            auVar122 = vfmsub231ps_fma(ZEXT1632(auVar122),auVar311,auVar238);
            auVar152 = vcmpps_avx(ZEXT1632(auVar214),_DAT_005191a0,2);
            auVar108 = vsubps_avx(ZEXT1632(auVar122),auVar165);
            auVar122 = vfmsub231ps_fma(auVar108,auVar355,auVar80);
            auVar256._8_4_ = 0xc0000000;
            auVar256._0_8_ = 0xc0000000c0000000;
            auVar256._12_4_ = 0xc0000000;
            auVar256._16_4_ = 0xc0000000;
            auVar256._20_4_ = 0xc0000000;
            auVar256._24_4_ = 0xc0000000;
            auVar256._28_4_ = 0xc0000000;
            auVar166._0_4_ = auVar122._0_4_ * -2.0;
            auVar166._4_4_ = auVar122._4_4_ * -2.0;
            auVar166._8_4_ = auVar122._8_4_ * -2.0;
            auVar166._12_4_ = auVar122._12_4_ * -2.0;
            auVar166._16_4_ = 0x80000000;
            auVar166._20_4_ = 0x80000000;
            auVar166._24_4_ = 0x80000000;
            auVar166._28_4_ = 0;
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar208._16_4_ = 0x7fffffff;
            auVar208._20_4_ = 0x7fffffff;
            auVar208._24_4_ = 0x7fffffff;
            auVar208._28_4_ = 0x7fffffff;
            auVar152 = vblendvps_avx(auVar166,auVar208,auVar152);
            auVar167._8_4_ = 0x42b0c0a5;
            auVar167._0_8_ = 0x42b0c0a542b0c0a5;
            auVar167._12_4_ = 0x42b0c0a5;
            auVar167._16_4_ = 0x42b0c0a5;
            auVar167._20_4_ = 0x42b0c0a5;
            auVar167._24_4_ = 0x42b0c0a5;
            auVar167._28_4_ = 0x42b0c0a5;
            auVar152 = vminps_avx(auVar152,auVar167);
            auVar168._8_4_ = 0xc2b0c0a5;
            auVar168._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar168._12_4_ = 0xc2b0c0a5;
            auVar168._16_4_ = 0xc2b0c0a5;
            auVar168._20_4_ = 0xc2b0c0a5;
            auVar168._24_4_ = 0xc2b0c0a5;
            auVar168._28_4_ = 0xc2b0c0a5;
            auVar80 = vmaxps_avx(auVar152,auVar168);
            auVar169._8_4_ = 0x3fb8aa3b;
            auVar169._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar169._12_4_ = 0x3fb8aa3b;
            auVar169._16_4_ = 0x3fb8aa3b;
            auVar169._20_4_ = 0x3fb8aa3b;
            auVar169._24_4_ = 0x3fb8aa3b;
            auVar169._28_4_ = 0x3fb8aa3b;
            auVar122 = vfmadd213ps_fma(auVar169,auVar80,auVar311);
            auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
            auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
            auVar152 = vandps_avx(auVar348,auVar152);
            auVar152 = vsubps_avx(auVar108,auVar152);
            auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar355);
            auVar178 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar298);
            auVar80 = ZEXT1632(auVar178);
            auVar24._28_4_ = auVar108._28_4_;
            auVar24._0_28_ =
                 ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                    CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                             CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                      auVar178._0_4_ * auVar178._0_4_))));
            auVar122 = vfmadd213ps_fma(auVar368,auVar80,auVar360);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar375);
            auVar273._8_4_ = 0x3d2aa9c1;
            auVar273._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar273._12_4_ = 0x3d2aa9c1;
            auVar273._16_4_ = 0x3d2aa9c1;
            auVar273._20_4_ = 0x3d2aa9c1;
            auVar273._24_4_ = 0x3d2aa9c1;
            auVar273._28_4_ = 0x3d2aa9c1;
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar273);
            auVar274._8_4_ = 0x3e2aaaaa;
            auVar274._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar274._12_4_ = 0x3e2aaaaa;
            auVar274._16_4_ = 0x3e2aaaaa;
            auVar274._20_4_ = 0x3e2aaaaa;
            auVar274._24_4_ = 0x3e2aaaaa;
            auVar274._28_4_ = 0x3e2aaaaa;
            auVar80 = ZEXT1632(auVar178);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar274);
            auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar311);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar24,auVar80);
            auVar90._0_4_ = (int)auVar152._0_4_;
            auVar90._4_4_ = (int)auVar152._4_4_;
            auVar90._8_4_ = (int)auVar152._8_4_;
            auVar90._12_4_ = (int)auVar152._12_4_;
            auVar111._16_4_ = (int)auVar152._16_4_;
            auVar111._0_16_ = auVar90;
            auVar111._20_4_ = (int)auVar152._20_4_;
            auVar111._24_4_ = (int)auVar152._24_4_;
            auVar111._28_4_ = (int)auVar152._28_4_;
            auVar178 = vpslld_avx(auVar90,0x17);
            auVar122 = vpslld_avx(auVar111._16_16_,0x17);
            auVar122 = vpaddd_avx(auVar122,auVar281);
            auVar178 = vpaddd_avx(auVar178,auVar281);
            auVar112._16_16_ = auVar122;
            auVar112._0_16_ = auVar178;
            auVar170._0_4_ = auVar214._0_4_ + 1.0;
            auVar170._4_4_ = auVar214._4_4_ + 1.0;
            auVar170._8_4_ = auVar214._8_4_ + 1.0;
            auVar170._12_4_ = auVar214._12_4_ + 1.0;
            auVar170._16_4_ = 0x3f800000;
            auVar170._20_4_ = 0x3f800000;
            auVar170._24_4_ = 0x3f800000;
            auVar170._28_4_ = 0x3f800000;
            auVar122 = vfmadd213ps_fma(auVar112,auVar170,auVar348);
            auVar152 = vrcpps_avx(ZEXT1632(auVar122));
            auVar122 = vfmsub213ps_fma(ZEXT1632(auVar122),auVar152,auVar348);
            auVar122 = vfnmadd132ps_fma(ZEXT1632(auVar122),auVar152,auVar152);
            auVar122 = vfnmadd213ps_fma(ZEXT1632(auVar122),auVar256,auVar340);
            auVar151 = ZEXT1628(auVar122);
            goto LAB_00305d36;
          case 6:
            uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
            auVar118._4_4_ = uVar15;
            auVar118._0_4_ = uVar15;
            auVar118._8_4_ = uVar15;
            auVar118._12_4_ = uVar15;
            auVar118._16_4_ = uVar15;
            auVar118._20_4_ = uVar15;
            auVar118._24_4_ = uVar15;
            auVar118._28_4_ = uVar15;
            uVar15 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
            auVar174._4_4_ = uVar15;
            auVar174._0_4_ = uVar15;
            auVar174._8_4_ = uVar15;
            auVar174._12_4_ = uVar15;
            auVar174._16_4_ = uVar15;
            auVar174._20_4_ = uVar15;
            auVar174._24_4_ = uVar15;
            auVar174._28_4_ = uVar15;
            auVar122 = vfmadd231ps_fma(auVar174,auVar78,auVar118);
            auVar152 = vmaxps_avx(ZEXT1632(auVar122),_DAT_005191a0);
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = 0x3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar152 = vminps_avx(auVar152,auVar175);
            auVar151 = auVar152._0_28_;
LAB_00305d36:
            auVar78._4_4_ = auVar151._4_4_ * fVar120;
            auVar78._0_4_ = auVar151._0_4_ * fVar84;
            auVar78._8_4_ = auVar151._8_4_ * auVar78._8_4_;
            auVar78._12_4_ = auVar151._12_4_ * auVar78._12_4_;
            auVar78._16_4_ = auVar151._16_4_ * auVar78._16_4_;
            auVar78._20_4_ = auVar151._20_4_ * auVar78._20_4_;
            auVar78._24_4_ = auVar151._24_4_ * auVar78._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_2d0 * 4) = auVar78;
          uVar29 = local_228 + 1;
          lVar44 = local_220 + 8;
          lVar38 = local_2d8 + 8;
          lVar41 = local_2e0 + 8;
          lVar45 = local_2e8 + 8;
          lVar48 = local_2f0 + 8;
          lVar50 = local_2f8 + 8;
          lVar59 = local_300 + 8;
          lVar54 = local_308 + 8;
        } while (uVar29 != uVar34);
      }
      uVar34 = uVar31 & 0xfffffffffffffff8;
      fVar84 = (float)((uint)(uVar31 >> 2) & 1);
      if ((uVar31 >> 2 & 1) != 0) {
        uStack_294 = 0;
        if (lVar52 == 0) {
          auVar122 = ZEXT816(0) << 0x40;
        }
        else {
          auVar122 = *(undefined1 (*) [16])(lVar52 + uVar34 * 4);
        }
        lVar44 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar19 = (this->weight_data_tm).data;
        local_288._0_8_ = uVar34;
        pauVar37 = (undefined1 (*) [16])(lVar44 * uVar34 + (long)pvVar19);
        pauVar60 = (undefined1 (*) [16])((uVar34 | 1) * lVar44 + (long)pvVar19);
        pauVar53 = (undefined1 (*) [16])((uVar34 | 2) * lVar44 + (long)pvVar19);
        pauVar56 = (undefined1 (*) [16])(lVar44 * (uVar34 | 3) + (long)pvVar19);
        pauVar49 = (undefined1 (*) [32])local_3b8._0_8_;
        if ((int)uVar40 < 8) {
          uVar27 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar27 = uVar40 & 0xfffffff8;
          auVar119 = ZEXT864(0);
          iVar26 = 7;
          auVar312 = ZEXT864(0);
          auVar376 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          do {
            auVar152 = *pauVar49;
            auVar178 = vlddqu_avx(*pauVar37);
            auVar80 = vcvtph2ps_f16c(auVar178);
            auVar178 = vlddqu_avx(*pauVar60);
            auVar108 = vcvtph2ps_f16c(auVar178);
            auVar178 = vlddqu_avx(*pauVar53);
            auVar78 = vcvtph2ps_f16c(auVar178);
            auVar178 = vlddqu_avx(*pauVar56);
            auVar118 = vcvtph2ps_f16c(auVar178);
            auVar178 = vfmadd231ps_fma(auVar210._0_32_,auVar152,auVar80);
            auVar210 = ZEXT1664(auVar178);
            local_1b8 = ZEXT1632(auVar178);
            auVar178 = vfmadd231ps_fma(auVar376._0_32_,auVar152,auVar108);
            auVar376 = ZEXT1664(auVar178);
            local_1f8 = ZEXT1632(auVar178);
            auVar178 = vfmadd231ps_fma(auVar312._0_32_,auVar152,auVar78);
            auVar312 = ZEXT1664(auVar178);
            local_1d8 = ZEXT1632(auVar178);
            auVar178 = vfmadd231ps_fma(auVar119._0_32_,auVar152,auVar118);
            auVar119 = ZEXT1664(auVar178);
            local_198 = ZEXT1632(auVar178);
            pauVar49 = pauVar49 + 1;
            pauVar37 = pauVar37 + 1;
            pauVar60 = pauVar60 + 1;
            pauVar53 = pauVar53 + 1;
            pauVar56 = pauVar56 + 1;
            iVar26 = iVar26 + 8;
          } while (iVar26 < (int)uVar40);
        }
        local_2a8 = ZEXT816(0) << 0x40;
        if ((int)(uVar27 | 3) < (int)uVar40) {
          auVar119 = ZEXT864(0);
          lVar44 = 0;
          auVar210 = ZEXT864(0);
          local_368 = ZEXT816(0);
          pauVar58 = pauVar49;
          uVar57 = uVar27;
          do {
            auVar214._8_8_ = 0;
            auVar214._0_8_ = *(ulong *)(*pauVar37 + lVar44);
            auVar214 = vcvtph2ps_f16c(auVar214);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(*pauVar60 + lVar44);
            auVar90 = vcvtph2ps_f16c(auVar11);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = *(ulong *)(*pauVar53 + lVar44);
            auVar260 = vcvtph2ps_f16c(auVar12);
            auVar178 = *(undefined1 (*) [16])(*pauVar49 + lVar44 * 2);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = *(ulong *)(*pauVar56 + lVar44);
            auVar281 = vcvtph2ps_f16c(auVar13);
            local_2a8 = vfmadd231ps_fma(local_2a8,auVar178,auVar214);
            local_368 = vfmadd231ps_fma(local_368,auVar178,auVar90);
            local_358 = vfmadd231ps_fma(auVar210._0_16_,auVar178,auVar260);
            auVar210 = ZEXT1664(local_358);
            local_348 = vfmadd231ps_fma(auVar119._0_16_,auVar178,auVar281);
            auVar119 = ZEXT1664(local_348);
            pauVar58 = (undefined1 (*) [32])(*pauVar58 + 0x10);
            uVar27 = uVar57 + 4;
            lVar44 = lVar44 + 8;
            iVar26 = uVar57 + 7;
            uVar57 = uVar27;
          } while (iVar26 < (int)uVar40);
          pauVar37 = (undefined1 (*) [16])(*pauVar37 + lVar44);
          pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar44);
          pauVar53 = (undefined1 (*) [16])(*pauVar53 + lVar44);
          pauVar56 = (undefined1 (*) [16])(*pauVar56 + lVar44);
          pauVar49 = pauVar58;
        }
        else {
          local_368 = ZEXT816(0);
          local_358 = SUB6416(ZEXT864(0),0);
          local_348 = SUB6416(ZEXT864(0),0);
        }
        local_278 = (ulong)(uVar40 - uVar27);
        local_298 = fVar84;
        if (uVar40 - uVar27 != 0 && (int)uVar27 <= (int)uVar40) {
          lVar44 = 0;
          do {
            local_2c8._0_16_ = auVar122;
            local_318 = ZEXT416(*(uint *)(*pauVar49 + lVar44 * 4));
            fVar84 = float16_to_float32(*(unsigned_short *)(*pauVar37 + lVar44 * 2));
            auVar152 = local_218;
            local_218._4_4_ = extraout_XMM0_Db_04;
            local_218._0_4_ = fVar84;
            local_218._8_4_ = extraout_XMM0_Dc_03;
            local_218._16_16_ = auVar152._16_16_;
            local_218._12_4_ = extraout_XMM0_Dd_03;
            local_328 = ZEXT416(*(uint *)(*pauVar49 + lVar44 * 4));
            local_338 = float16_to_float32(*(unsigned_short *)(*pauVar60 + lVar44 * 2));
            local_248 = ZEXT416(*(uint *)(*pauVar49 + lVar44 * 4));
            local_258 = float16_to_float32(*(unsigned_short *)(*pauVar53 + lVar44 * 2));
            local_268 = ZEXT416(*(uint *)(*pauVar49 + lVar44 * 4));
            auVar210._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar56 + lVar44 * 2));
            auVar210._4_60_ = extraout_var_00;
            auVar122 = vinsertps_avx(local_218._0_16_,ZEXT416((uint)local_338),0x10);
            auVar122 = vinsertps_avx(auVar122,ZEXT416((uint)local_258),0x20);
            auVar122 = vinsertps_avx(auVar122,auVar210._0_16_,0x30);
            auVar178 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
            auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_248._0_4_),0x20);
            auVar178 = vinsertps_avx(auVar178,ZEXT416((uint)local_268._0_4_),0x30);
            auVar122 = vfmadd231ps_fma(local_2c8._0_16_,auVar122,auVar178);
            lVar44 = lVar44 + 1;
          } while ((uint)local_278 != (int)lVar44);
        }
        auVar152 = vhaddps_avx(local_1b8,local_1f8);
        auVar80 = vhaddps_avx(local_1d8,local_198);
        auVar152 = vhaddps_avx(auVar152,auVar80);
        auVar214 = vunpcklps_avx(local_2a8,local_368);
        auVar90 = vunpcklps_avx(local_358,local_348);
        auVar260 = vunpckhps_avx(local_2a8,local_368);
        auVar281 = vunpckhps_avx(local_358,local_348);
        auVar178 = vmovlhps_avx(auVar214,auVar90);
        auVar90 = vunpckhpd_avx(auVar214,auVar90);
        auVar214 = vmovlhps_avx(auVar260,auVar281);
        auVar260 = vunpckhpd_avx(auVar260,auVar281);
        auVar70._0_4_ =
             auVar90._0_4_ + auVar178._0_4_ + auVar214._0_4_ + auVar260._0_4_ +
             auVar122._0_4_ + auVar152._0_4_ + auVar152._16_4_;
        auVar70._4_4_ =
             auVar90._4_4_ + auVar178._4_4_ + auVar214._4_4_ + auVar260._4_4_ +
             auVar122._4_4_ + auVar152._4_4_ + auVar152._20_4_;
        auVar70._8_4_ =
             auVar90._8_4_ + auVar178._8_4_ + auVar214._8_4_ + auVar260._8_4_ +
             auVar122._8_4_ + auVar152._8_4_ + auVar152._24_4_;
        auVar70._12_4_ =
             auVar90._12_4_ + auVar178._12_4_ + auVar214._12_4_ + auVar260._12_4_ +
             auVar122._12_4_ + auVar152._12_4_ + auVar152._28_4_;
        switch(iVar51) {
        case 1:
          auVar70 = vmaxps_avx(auVar70,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar122 = vmaxps_avx(auVar70,ZEXT816(0) << 0x20);
          auVar178 = vminps_avx(auVar70,ZEXT816(0) << 0x20);
          uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar74._4_4_ = uVar15;
          auVar74._0_4_ = uVar15;
          auVar74._8_4_ = uVar15;
          auVar74._12_4_ = uVar15;
          auVar70 = vfmadd213ps_fma(auVar74,auVar178,auVar122);
          break;
        case 3:
          uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar94._4_4_ = uVar15;
          auVar94._0_4_ = uVar15;
          auVar94._8_4_ = uVar15;
          auVar94._12_4_ = uVar15;
          uVar15 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar144._4_4_ = uVar15;
          auVar144._0_4_ = uVar15;
          auVar144._8_4_ = uVar15;
          auVar144._12_4_ = uVar15;
          auVar122 = vmaxps_avx(auVar70,auVar94);
          auVar70 = vminps_avx(auVar122,auVar144);
          break;
        case 4:
          uVar34 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
          auVar71._0_8_ = uVar34 ^ 0x8000000080000000;
          auVar71._8_4_ = -auVar70._8_4_;
          auVar71._12_4_ = -auVar70._12_4_;
          auVar95._8_4_ = 0x42b0c0a5;
          auVar95._0_8_ = 0x42b0c0a542b0c0a5;
          auVar95._12_4_ = 0x42b0c0a5;
          auVar122 = vminps_avx(auVar71,auVar95);
          auVar96._8_4_ = 0xc2b0c0a5;
          auVar96._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar96._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar122,auVar96);
          auVar97._8_4_ = 0x3fb8aa3b;
          auVar97._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar97._12_4_ = 0x3fb8aa3b;
          auVar145._8_4_ = 0x3f000000;
          auVar145._0_8_ = 0x3f0000003f000000;
          auVar145._12_4_ = 0x3f000000;
          auVar122 = vfmadd213ps_fma(auVar97,auVar214,auVar145);
          auVar193._0_4_ = (int)auVar122._0_4_;
          auVar193._4_4_ = (int)auVar122._4_4_;
          auVar193._8_4_ = (int)auVar122._8_4_;
          auVar193._12_4_ = (int)auVar122._12_4_;
          auVar178 = vcvtdq2ps_avx(auVar193);
          auVar122 = vcmpps_avx(auVar122,auVar178,1);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar122 = vandps_avx(auVar122,auVar98);
          auVar122 = vsubps_avx(auVar178,auVar122);
          auVar232._8_4_ = 0x3f318000;
          auVar232._0_8_ = 0x3f3180003f318000;
          auVar232._12_4_ = 0x3f318000;
          auVar178 = vfmsub213ps_fma(auVar232,auVar122,auVar214);
          auVar72._8_4_ = 0x395e8083;
          auVar72._0_8_ = 0x395e8083395e8083;
          auVar72._12_4_ = 0x395e8083;
          auVar214 = vfmsub213ps_fma(auVar72,auVar122,auVar178);
          auVar233._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar233._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar233._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar233._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar243._8_4_ = 0x3ab743ce;
          auVar243._0_8_ = 0x3ab743ce3ab743ce;
          auVar243._12_4_ = 0x3ab743ce;
          auVar262._8_4_ = 0x39506967;
          auVar262._0_8_ = 0x3950696739506967;
          auVar262._12_4_ = 0x39506967;
          auVar178 = vfmadd213ps_fma(auVar262,auVar214,auVar243);
          auVar244._8_4_ = 0x3c088908;
          auVar244._0_8_ = 0x3c0889083c088908;
          auVar244._12_4_ = 0x3c088908;
          auVar178 = vfmadd231ps_fma(auVar244,auVar214,auVar178);
          auVar263._8_4_ = 0x3d2aa9c1;
          auVar263._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar263._12_4_ = 0x3d2aa9c1;
          auVar178 = vfmadd231ps_fma(auVar263,auVar214,auVar178);
          auVar245._8_4_ = 0x3e2aaaaa;
          auVar245._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar245._12_4_ = 0x3e2aaaaa;
          auVar178 = vfmadd231ps_fma(auVar245,auVar214,auVar178);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar145);
          auVar178 = vfmadd213ps_fma(auVar178,auVar233,auVar214);
          auVar146._0_4_ = auVar178._0_4_ + 1.0;
          auVar146._4_4_ = auVar178._4_4_ + 1.0;
          auVar146._8_4_ = auVar178._8_4_ + 1.0;
          auVar146._12_4_ = auVar178._12_4_ + 1.0;
          auVar73._0_4_ = (int)auVar122._0_4_;
          auVar73._4_4_ = (int)auVar122._4_4_;
          auVar73._8_4_ = (int)auVar122._8_4_;
          auVar73._12_4_ = (int)auVar122._12_4_;
          auVar122 = vpslld_avx(auVar73,0x17);
          auVar122 = vpaddd_avx(auVar122,auVar98);
          auVar178 = vfmadd213ps_fma(auVar122,auVar146,auVar98);
          auVar122 = vrcpps_avx(auVar178);
          auVar178 = vfmsub213ps_fma(auVar178,auVar122,auVar98);
          auVar70 = vfnmadd132ps_fma(auVar178,auVar122,auVar122);
          break;
        case 5:
          auVar91._8_4_ = 0x42b0c0a5;
          auVar91._0_8_ = 0x42b0c0a542b0c0a5;
          auVar91._12_4_ = 0x42b0c0a5;
          auVar122 = vminps_avx(auVar70,auVar91);
          auVar132._8_4_ = 0xc2b0c0a5;
          auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar132._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar122,auVar132);
          auVar242._8_4_ = 0x3fb8aa3b;
          auVar242._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar242._12_4_ = 0x3fb8aa3b;
          auVar282._8_4_ = 0x3f000000;
          auVar282._0_8_ = 0x3f0000003f000000;
          auVar282._12_4_ = 0x3f000000;
          auVar122 = vfmadd213ps_fma(auVar242,auVar214,auVar282);
          auVar190._0_4_ = (int)auVar122._0_4_;
          auVar190._4_4_ = (int)auVar122._4_4_;
          auVar190._8_4_ = (int)auVar122._8_4_;
          auVar190._12_4_ = (int)auVar122._12_4_;
          auVar178 = vcvtdq2ps_avx(auVar190);
          auVar122 = vcmpps_avx(auVar122,auVar178,1);
          auVar261._8_4_ = 0x3f800000;
          auVar261._0_8_ = 0x3f8000003f800000;
          auVar261._12_4_ = 0x3f800000;
          auVar122 = vandps_avx(auVar122,auVar261);
          auVar122 = vsubps_avx(auVar178,auVar122);
          auVar191._8_4_ = 0x3f318000;
          auVar191._0_8_ = 0x3f3180003f318000;
          auVar191._12_4_ = 0x3f318000;
          auVar178 = vfmsub231ps_fma(auVar214,auVar122,auVar191);
          auVar295._8_4_ = 0xb95e8083;
          auVar295._0_8_ = 0xb95e8083b95e8083;
          auVar295._12_4_ = 0xb95e8083;
          auVar214 = vfnmsub231ps_fma(auVar178,auVar122,auVar295);
          auVar370._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar370._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar370._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar370._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar133._8_4_ = 0x3ab743ce;
          auVar133._0_8_ = 0x3ab743ce3ab743ce;
          auVar133._12_4_ = 0x3ab743ce;
          auVar92._8_4_ = 0x39506967;
          auVar92._0_8_ = 0x3950696739506967;
          auVar92._12_4_ = 0x39506967;
          auVar178 = vfmadd213ps_fma(auVar92,auVar214,auVar133);
          auVar322._8_4_ = 0x3c088908;
          auVar322._0_8_ = 0x3c0889083c088908;
          auVar322._12_4_ = 0x3c088908;
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar322);
          auVar344._8_4_ = 0x3d2aa9c1;
          auVar344._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar344._12_4_ = 0x3d2aa9c1;
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar344);
          auVar351._8_4_ = 0x3e2aaaaa;
          auVar351._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar351._12_4_ = 0x3e2aaaaa;
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar351);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar282);
          auVar178 = vfmadd213ps_fma(auVar178,auVar370,auVar214);
          auVar220._0_4_ = auVar178._0_4_ + 1.0;
          auVar220._4_4_ = auVar178._4_4_ + 1.0;
          auVar220._8_4_ = auVar178._8_4_ + 1.0;
          auVar220._12_4_ = auVar178._12_4_ + 1.0;
          auVar362._0_4_ = (int)auVar122._0_4_;
          auVar362._4_4_ = (int)auVar122._4_4_;
          auVar362._8_4_ = (int)auVar122._8_4_;
          auVar362._12_4_ = (int)auVar122._12_4_;
          auVar122 = vpslld_avx(auVar362,0x17);
          auVar122 = vpaddd_avx(auVar122,auVar261);
          auVar122 = vfmadd213ps_fma(auVar122,auVar220,auVar261);
          auVar178 = vcmpps_avx(auVar122,ZEXT816(0) << 0x40,2);
          auVar221._8_4_ = 0x800000;
          auVar221._0_8_ = 0x80000000800000;
          auVar221._12_4_ = 0x800000;
          auVar122 = vmaxps_avx(auVar122,auVar221);
          auVar214 = vpsrld_avx(auVar122,0x17);
          auVar371._8_4_ = 0x807fffff;
          auVar371._0_8_ = 0x807fffff807fffff;
          auVar371._12_4_ = 0x807fffff;
          auVar122 = vandps_avx(auVar371,auVar122);
          auVar90 = vorps_avx(auVar122,auVar282);
          auVar372._8_4_ = 0xffffff82;
          auVar372._0_8_ = 0xffffff82ffffff82;
          auVar372._12_4_ = 0xffffff82;
          auVar260 = vpaddd_avx(auVar214,auVar372);
          auVar363._8_4_ = 0x3f3504f3;
          auVar363._0_8_ = 0x3f3504f33f3504f3;
          auVar363._12_4_ = 0x3f3504f3;
          auVar214 = vcmpps_avx(auVar90,auVar363,1);
          auVar122 = vandps_avx(auVar214,auVar90);
          auVar364._0_4_ = auVar90._0_4_ + -1.0 + auVar122._0_4_;
          auVar364._4_4_ = auVar90._4_4_ + -1.0 + auVar122._4_4_;
          auVar364._8_4_ = auVar90._8_4_ + -1.0 + auVar122._8_4_;
          auVar364._12_4_ = auVar90._12_4_ + -1.0 + auVar122._12_4_;
          auVar90 = vcvtdq2ps_avx(auVar260);
          auVar122 = vandps_avx(auVar214,auVar261);
          auVar122 = vsubps_avx(auVar90,auVar122);
          auVar134._8_4_ = 0xbdebd1b8;
          auVar134._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar134._12_4_ = 0xbdebd1b8;
          auVar222._8_4_ = 0x3d9021bb;
          auVar222._0_8_ = 0x3d9021bb3d9021bb;
          auVar222._12_4_ = 0x3d9021bb;
          auVar214 = vfmadd213ps_fma(auVar222,auVar364,auVar134);
          auVar135._8_4_ = 0x3def251a;
          auVar135._0_8_ = 0x3def251a3def251a;
          auVar135._12_4_ = 0x3def251a;
          auVar214 = vfmadd231ps_fma(auVar135,auVar364,auVar214);
          auVar223._8_4_ = 0xbdfe5d4f;
          auVar223._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar223._12_4_ = 0xbdfe5d4f;
          auVar214 = vfmadd231ps_fma(auVar223,auVar364,auVar214);
          auVar136._8_4_ = 0x3e11e9bf;
          auVar136._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar136._12_4_ = 0x3e11e9bf;
          auVar214 = vfmadd231ps_fma(auVar136,auVar364,auVar214);
          auVar224._8_4_ = 0xbe2aae50;
          auVar224._0_8_ = 0xbe2aae50be2aae50;
          auVar224._12_4_ = 0xbe2aae50;
          auVar214 = vfmadd231ps_fma(auVar224,auVar364,auVar214);
          auVar137._8_4_ = 0x3e4cceac;
          auVar137._0_8_ = 0x3e4cceac3e4cceac;
          auVar137._12_4_ = 0x3e4cceac;
          auVar214 = vfmadd231ps_fma(auVar137,auVar364,auVar214);
          auVar225._8_4_ = 0xbe7ffffc;
          auVar225._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar225._12_4_ = 0xbe7ffffc;
          auVar214 = vfmadd231ps_fma(auVar225,auVar364,auVar214);
          auVar138._8_4_ = 0x3eaaaaaa;
          auVar138._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar138._12_4_ = 0x3eaaaaaa;
          auVar214 = vfmadd231ps_fma(auVar138,auVar364,auVar214);
          auVar226._0_4_ = auVar364._0_4_ * auVar364._0_4_;
          auVar226._4_4_ = auVar364._4_4_ * auVar364._4_4_;
          auVar226._8_4_ = auVar364._8_4_ * auVar364._8_4_;
          auVar226._12_4_ = auVar364._12_4_ * auVar364._12_4_;
          auVar139._0_4_ = auVar364._0_4_ * auVar226._0_4_ * auVar214._0_4_;
          auVar139._4_4_ = auVar364._4_4_ * auVar226._4_4_ * auVar214._4_4_;
          auVar139._8_4_ = auVar364._8_4_ * auVar226._8_4_ * auVar214._8_4_;
          auVar139._12_4_ = auVar364._12_4_ * auVar226._12_4_ * auVar214._12_4_;
          auVar214 = vfmadd231ps_fma(auVar139,auVar122,auVar295);
          auVar214 = vfmsub231ps_fma(auVar214,auVar282,auVar226);
          auVar214 = vsubps_avx(auVar214,auVar364);
          auVar122 = vfnmadd231ps_fma(auVar214,auVar191,auVar122);
          auVar140._0_4_ = auVar122._0_4_ + auVar122._0_4_;
          auVar140._4_4_ = auVar122._4_4_ + auVar122._4_4_;
          auVar140._8_4_ = auVar122._8_4_ + auVar122._8_4_;
          auVar140._12_4_ = auVar122._12_4_ + auVar122._12_4_;
          auVar227._8_4_ = 0x7fffffff;
          auVar227._0_8_ = 0x7fffffff7fffffff;
          auVar227._12_4_ = 0x7fffffff;
          auVar122 = vblendvps_avx(auVar140,auVar227,auVar178);
          auVar228._8_4_ = 0x42b0c0a5;
          auVar228._0_8_ = 0x42b0c0a542b0c0a5;
          auVar228._12_4_ = 0x42b0c0a5;
          auVar122 = vminps_avx(auVar122,auVar228);
          auVar229._8_4_ = 0xc2b0c0a5;
          auVar229._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar229._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar122,auVar229);
          auVar122 = vfmadd213ps_fma(auVar242,auVar214,auVar282);
          auVar230._0_4_ = (int)auVar122._0_4_;
          auVar230._4_4_ = (int)auVar122._4_4_;
          auVar230._8_4_ = (int)auVar122._8_4_;
          auVar230._12_4_ = (int)auVar122._12_4_;
          auVar178 = vcvtdq2ps_avx(auVar230);
          auVar122 = vcmpps_avx(auVar122,auVar178,1);
          auVar122 = vandps_avx(auVar122,auVar261);
          auVar122 = vsubps_avx(auVar178,auVar122);
          auVar178 = vfmsub213ps_fma(auVar191,auVar122,auVar214);
          auVar214 = vfnmsub231ps_fma(auVar178,auVar122,auVar295);
          auVar141._8_4_ = 0x3ab743ce;
          auVar141._0_8_ = 0x3ab743ce3ab743ce;
          auVar141._12_4_ = 0x3ab743ce;
          auVar178 = vfmadd213ps_fma(auVar92,auVar214,auVar141);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar322);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar344);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar351);
          auVar178 = vfmadd213ps_fma(auVar178,auVar214,auVar282);
          auVar142._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar142._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar142._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar142._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar178 = vfmadd213ps_fma(auVar178,auVar142,auVar214);
          auVar93._0_4_ = auVar178._0_4_ + 1.0;
          auVar93._4_4_ = auVar178._4_4_ + 1.0;
          auVar93._8_4_ = auVar178._8_4_ + 1.0;
          auVar93._12_4_ = auVar178._12_4_ + 1.0;
          auVar143._0_4_ = (int)auVar122._0_4_;
          auVar143._4_4_ = (int)auVar122._4_4_;
          auVar143._8_4_ = (int)auVar122._8_4_;
          auVar143._12_4_ = (int)auVar122._12_4_;
          auVar122 = vpslld_avx(auVar143,0x17);
          auVar122 = vpaddd_avx(auVar122,auVar261);
          auVar178 = vfmadd213ps_fma(auVar122,auVar93,auVar261);
          auVar122 = vrcpps_avx(auVar178);
          auVar192._0_4_ = auVar122._0_4_ + auVar122._0_4_;
          auVar192._4_4_ = auVar122._4_4_ + auVar122._4_4_;
          auVar192._8_4_ = auVar122._8_4_ + auVar122._8_4_;
          auVar192._12_4_ = auVar122._12_4_ + auVar122._12_4_;
          auVar231._8_4_ = 0x40000000;
          auVar231._0_8_ = 0x4000000040000000;
          auVar231._12_4_ = 0x40000000;
          auVar178 = vfmsub231ps_fma(auVar231,auVar192,auVar178);
          auVar122 = vfnmadd213ps_fma(auVar178,auVar122,auVar192);
          auVar70 = vfmsub231ps_fma(auVar70,auVar70,auVar122);
          break;
        case 6:
          uVar15 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar99._4_4_ = uVar15;
          auVar99._0_4_ = uVar15;
          auVar99._8_4_ = uVar15;
          auVar99._12_4_ = uVar15;
          uVar15 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar147._4_4_ = uVar15;
          auVar147._0_4_ = uVar15;
          auVar147._8_4_ = uVar15;
          auVar147._12_4_ = uVar15;
          auVar122 = vfmadd231ps_fma(auVar147,auVar70,auVar99);
          auVar122 = vmaxps_avx(auVar122,ZEXT416(0) << 0x20);
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar122 = vminps_avx(auVar122,auVar148);
          auVar70._0_4_ = auVar122._0_4_ * auVar70._0_4_;
          auVar70._4_4_ = auVar122._4_4_ * auVar70._4_4_;
          auVar70._8_4_ = auVar122._8_4_ * auVar70._8_4_;
          auVar70._12_4_ = auVar122._12_4_ * auVar70._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + local_288._0_8_ * 4) = auVar70;
        uVar34 = local_288._0_8_;
        fVar84 = local_298;
      }
      iVar30 = (int)uVar34 + (int)fVar84 * 4;
      iVar26 = 0;
      if (iVar16 <= iVar30) goto LAB_003068c3;
      local_338 = (float)(uVar40 & 0xfffffff8);
      uVar34 = (ulong)iVar30;
      do {
        auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar52 != 0) {
          auVar119 = ZEXT464(*(uint *)(lVar52 + uVar34 * 4));
        }
        fVar84 = auVar119._0_4_;
        pauVar37 = (undefined1 (*) [16])
                   ((long)(this->weight_data_tm).w * uVar34 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar49 = (undefined1 (*) [32])local_3b8._0_8_;
        if ((int)uVar40 < 8) {
          auVar122 = ZEXT816(0);
          fVar120 = 0.0;
        }
        else {
          auVar122 = ZEXT816(0);
          iVar26 = 7;
          do {
            auVar178 = vlddqu_avx(*pauVar37);
            auVar152 = vcvtph2ps_f16c(auVar178);
            auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar152,*pauVar49);
            pauVar49 = pauVar49 + 1;
            pauVar37 = pauVar37 + 1;
            iVar26 = iVar26 + 8;
            fVar120 = local_338;
          } while (iVar26 < (int)uVar40);
        }
        local_218 = ZEXT1632(auVar122);
        local_328 = ZEXT816(0) << 0x40;
        uVar27 = (uint)fVar120 | 3;
        while ((int)uVar27 < (int)uVar40) {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)*pauVar37;
          auVar122 = vcvtph2ps_f16c(auVar14);
          local_328 = vfmadd231ps_fma(local_328,auVar122,*(undefined1 (*) [16])*pauVar49);
          pauVar49 = (undefined1 (*) [32])(*pauVar49 + 0x10);
          pauVar37 = (undefined1 (*) [16])(*pauVar37 + 8);
          uVar27 = (int)fVar120 + 7;
          fVar120 = (float)((int)fVar120 + 4);
        }
        if ((int)fVar120 < (int)uVar40) {
          lVar44 = 0;
          do {
            local_2c8._0_4_ = auVar119._0_4_;
            local_318._0_4_ = *(undefined4 *)(*pauVar49 + lVar44 * 4);
            auVar312._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar37 + lVar44 * 2));
            auVar312._4_60_ = extraout_var_01;
            auVar122 = vfmadd231ss_fma(ZEXT416((uint)local_2c8._0_4_),auVar312._0_16_,
                                       ZEXT416((uint)local_318._0_4_));
            fVar84 = auVar122._0_4_;
            auVar119 = ZEXT1664(auVar122);
            lVar44 = lVar44 + 1;
          } while (uVar40 - (int)fVar120 != (int)lVar44);
        }
        auVar122 = vshufpd_avx(local_328,local_328,1);
        auVar100._0_4_ = auVar122._0_4_ + local_328._0_4_;
        auVar100._4_4_ = auVar122._4_4_ + local_328._4_4_;
        auVar100._8_4_ = auVar122._8_4_ + local_328._8_4_;
        auVar100._12_4_ = auVar122._12_4_ + local_328._12_4_;
        auVar122 = vhaddps_avx(local_218._16_16_,local_218._0_16_);
        auVar178 = vmovshdup_avx(auVar100);
        auVar122 = vhaddps_avx(auVar122,auVar122);
        auVar122 = vhaddps_avx(auVar122,auVar122);
        fVar84 = auVar122._0_4_ + auVar178._0_4_ + auVar100._0_4_ + fVar84;
        auVar122 = ZEXT416((uint)fVar84);
        fVar120 = fVar84;
        if (iVar51 - 1U < 6) {
          switch(iVar51) {
          case 1:
            auVar122 = vmaxss_avx(ZEXT416((uint)fVar84),ZEXT416(0));
            fVar120 = auVar122._0_4_;
            break;
          case 2:
            auVar75._0_12_ = ZEXT812(0);
            auVar75._12_4_ = 0;
            auVar122 = vcmpss_avx(auVar75,ZEXT416((uint)fVar84),1);
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar122 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var17)),
                                     auVar150,auVar122);
            fVar120 = auVar122._0_4_ * fVar84;
            break;
          case 3:
            fVar84 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var17))[1];
            auVar122 = vmaxss_avx(auVar122,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var17)));
            fVar120 = auVar122._0_4_;
            if (fVar84 < auVar122._0_4_) {
              fVar120 = fVar84;
            }
            break;
          case 4:
            auVar122 = vminss_avx(auVar122,ZEXT416(0x42b0c0a5));
            auVar101._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar122._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar122._12_4_ ^ 0x80000000;
            auVar122 = vcmpss_avx(auVar122,ZEXT416(0xc2b0c0a5),1);
            auVar149._8_4_ = 0x42b0c0a5;
            auVar149._0_8_ = 0x42b0c0a542b0c0a5;
            auVar149._12_4_ = 0x42b0c0a5;
            auVar122 = vblendvps_avx(auVar101,auVar149,auVar122);
            fVar84 = expf(auVar122._0_4_);
            fVar120 = 1.0 / (fVar84 + 1.0);
            break;
          case 5:
            local_2c8._0_4_ = fVar84;
            fVar84 = expf(fVar84);
            fVar84 = logf(fVar84 + 1.0);
            fVar84 = tanhf(fVar84);
            fVar120 = fVar84 * (float)local_2c8._0_4_;
            break;
          case 6:
            fVar2 = **(float **)(&this->field_0xe8 + (long)p_Var17);
            fVar3 = (*(float **)(&this->field_0xe8 + (long)p_Var17))[1];
            fVar177 = -fVar3 / fVar2;
            fVar120 = 0.0;
            if ((fVar177 <= fVar84) && (fVar120 = fVar84, fVar84 <= fVar177 + 1.0 / fVar2)) {
              auVar122 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar122,ZEXT416((uint)fVar3));
              fVar120 = auVar122._0_4_ * fVar84;
            }
          }
        }
        *(float *)((long)top_blob->data + uVar34 * 4) = fVar120;
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar31);
    }
    else if (iVar51 == 4) {
      iVar51 = top_blob->w;
      iVar26 = 0;
      if ((long)iVar51 < 1) goto LAB_003068c3;
      p_Var17 = this->_vptr_InnerProduct_x86_fma[-3];
      uVar15 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var17);
      lVar52 = *(long *)(&this->field_0x178 + (long)p_Var17);
      uVar40 = local_3a0 * local_38c;
      lVar44 = 0;
      auVar119 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        auVar122 = ZEXT816(0) << 0x40;
        if (lVar52 != 0) {
          auVar122 = *(undefined1 (*) [16])(lVar52 + lVar44 * 0x10);
        }
        pauVar49 = (undefined1 (*) [32])
                   ((this->weight_data_tm).w * lVar44 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar35 = (undefined4 *)local_3b8._0_8_;
        if ((int)uVar40 < 8) {
          auVar152 = SUB6432(ZEXT864(0),0);
          auVar80 = SUB6432(ZEXT864(0),0);
          auVar210 = ZEXT864(0);
          auVar312 = ZEXT864(0);
          uVar27 = 0;
        }
        else {
          auVar312 = ZEXT864(0);
          iVar26 = 7;
          auVar210 = ZEXT864(0);
          auVar176 = ZEXT864(0);
          auVar376 = ZEXT864(0);
          do {
            uVar1 = *puVar35;
            auVar236._4_4_ = uVar1;
            auVar236._0_4_ = uVar1;
            auVar236._8_4_ = uVar1;
            auVar236._12_4_ = uVar1;
            uVar1 = puVar35[1];
            auVar236._20_4_ = uVar1;
            auVar236._16_4_ = uVar1;
            auVar236._24_4_ = uVar1;
            auVar236._28_4_ = uVar1;
            uVar1 = puVar35[2];
            auVar309._4_4_ = uVar1;
            auVar309._0_4_ = uVar1;
            auVar309._8_4_ = uVar1;
            auVar309._12_4_ = uVar1;
            uVar1 = puVar35[3];
            auVar309._20_4_ = uVar1;
            auVar309._16_4_ = uVar1;
            auVar309._24_4_ = uVar1;
            auVar309._28_4_ = uVar1;
            uVar1 = puVar35[4];
            auVar347._4_4_ = uVar1;
            auVar347._0_4_ = uVar1;
            auVar347._8_4_ = uVar1;
            auVar347._12_4_ = uVar1;
            uVar1 = puVar35[5];
            auVar347._20_4_ = uVar1;
            auVar347._16_4_ = uVar1;
            auVar347._24_4_ = uVar1;
            auVar347._28_4_ = uVar1;
            uVar1 = puVar35[6];
            auVar354._4_4_ = uVar1;
            auVar354._0_4_ = uVar1;
            auVar354._8_4_ = uVar1;
            auVar354._12_4_ = uVar1;
            uVar1 = puVar35[7];
            auVar354._20_4_ = uVar1;
            auVar354._16_4_ = uVar1;
            auVar354._24_4_ = uVar1;
            auVar354._28_4_ = uVar1;
            auVar152 = vlddqu_avx(*pauVar49);
            auVar108 = vlddqu_avx(pauVar49[1]);
            auVar80 = vcvtph2ps_f16c(auVar152._0_16_);
            auVar178 = vfmadd231ps_fma(auVar312._0_32_,auVar236,auVar80);
            auVar312 = ZEXT1664(auVar178);
            auVar152 = vcvtph2ps_f16c(auVar152._16_16_);
            auVar178 = vfmadd231ps_fma(auVar210._0_32_,auVar309,auVar152);
            auVar210 = ZEXT1664(auVar178);
            auVar152 = vcvtph2ps_f16c(auVar108._0_16_);
            auVar178 = vfmadd231ps_fma(auVar176._0_32_,auVar347,auVar152);
            auVar176 = ZEXT1664(auVar178);
            auVar80 = ZEXT1632(auVar178);
            auVar152 = vcvtph2ps_f16c(auVar108._16_16_);
            auVar178 = vfmadd231ps_fma(auVar376._0_32_,auVar354,auVar152);
            auVar376 = ZEXT1664(auVar178);
            auVar152 = ZEXT1632(auVar178);
            puVar35 = puVar35 + 8;
            pauVar49 = pauVar49 + 2;
            iVar26 = iVar26 + 8;
            uVar27 = uVar40 & 0xfffffff8;
          } while (iVar26 < (int)uVar40);
        }
        auVar78 = auVar312._0_32_;
        auVar108 = auVar210._0_32_;
        uVar57 = uVar27 | 3;
        while ((int)uVar57 < (int)uVar40) {
          uVar1 = *puVar35;
          auVar237._4_4_ = uVar1;
          auVar237._0_4_ = uVar1;
          auVar237._8_4_ = uVar1;
          auVar237._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar237._20_4_ = uVar1;
          auVar237._16_4_ = uVar1;
          auVar237._24_4_ = uVar1;
          auVar237._28_4_ = uVar1;
          uVar1 = puVar35[2];
          auVar310._4_4_ = uVar1;
          auVar310._0_4_ = uVar1;
          auVar310._8_4_ = uVar1;
          auVar310._12_4_ = uVar1;
          uVar1 = puVar35[3];
          auVar310._20_4_ = uVar1;
          auVar310._16_4_ = uVar1;
          auVar310._24_4_ = uVar1;
          auVar310._28_4_ = uVar1;
          auVar108 = vlddqu_avx(*pauVar49);
          auVar78 = vcvtph2ps_f16c(auVar108._0_16_);
          auVar178 = vfmadd231ps_fma(auVar312._0_32_,auVar237,auVar78);
          auVar312 = ZEXT1664(auVar178);
          auVar78 = ZEXT1632(auVar178);
          auVar108 = vcvtph2ps_f16c(auVar108._16_16_);
          auVar178 = vfmadd231ps_fma(auVar210._0_32_,auVar310,auVar108);
          auVar210 = ZEXT1664(auVar178);
          auVar108 = ZEXT1632(auVar178);
          puVar35 = puVar35 + 4;
          pauVar49 = pauVar49 + 1;
          uVar57 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if (uVar40 - uVar27 != 0 && (int)uVar27 <= (int)uVar40) {
          lVar59 = 0;
          do {
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(*pauVar49 + lVar59 * 8);
            auVar178 = vcvtph2ps_f16c(auVar10);
            uVar1 = puVar35[lVar59];
            auVar299._4_4_ = uVar1;
            auVar299._0_4_ = uVar1;
            auVar299._8_4_ = uVar1;
            auVar299._12_4_ = uVar1;
            auVar122 = vfmadd231ps_fma(auVar122,auVar299,auVar178);
            lVar59 = lVar59 + 1;
          } while (uVar40 - uVar27 != (int)lVar59);
        }
        fVar84 = auVar80._4_4_ + auVar152._4_4_ + auVar78._4_4_ + auVar108._4_4_;
        auVar86._0_4_ =
             auVar122._0_4_ +
             auVar80._16_4_ + auVar152._16_4_ + auVar78._16_4_ + auVar108._16_4_ +
             auVar80._0_4_ + auVar152._0_4_ + auVar78._0_4_ + auVar108._0_4_;
        auVar86._4_4_ = auVar122._4_4_ + fVar84 + fVar84;
        auVar86._8_4_ =
             auVar122._8_4_ +
             auVar80._24_4_ + auVar152._24_4_ + auVar78._24_4_ + auVar108._24_4_ +
             auVar80._8_4_ + auVar152._8_4_ + auVar78._8_4_ + auVar108._8_4_;
        auVar86._12_4_ =
             auVar122._12_4_ +
             auVar80._28_4_ + auVar152._28_4_ + auVar78._28_4_ + auVar108._28_4_ +
             auVar80._12_4_ + auVar152._12_4_ + auVar78._12_4_ + auVar108._12_4_;
        auVar122 = auVar119._0_16_;
        fVar84 = auVar119._0_4_;
        fVar120 = auVar119._4_4_;
        fVar2 = auVar119._8_4_;
        fVar3 = auVar119._12_4_;
        switch(uVar15) {
        case 1:
          auVar86 = vmaxps_avx(auVar86,_DAT_00514070);
          break;
        case 2:
          auVar122 = vmaxps_avx(auVar86,ZEXT816(0) << 0x40);
          auVar178 = vminps_avx(auVar86,ZEXT816(0) << 0x40);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar89._4_4_ = uVar1;
          auVar89._0_4_ = uVar1;
          auVar89._8_4_ = uVar1;
          auVar89._12_4_ = uVar1;
          auVar86 = vfmadd213ps_fma(auVar89,auVar178,auVar122);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar126._4_4_ = uVar1;
          auVar126._0_4_ = uVar1;
          auVar126._8_4_ = uVar1;
          auVar126._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar184._4_4_ = uVar1;
          auVar184._0_4_ = uVar1;
          auVar184._8_4_ = uVar1;
          auVar184._12_4_ = uVar1;
          auVar122 = vmaxps_avx(auVar86,auVar126);
          auVar86 = vminps_avx(auVar122,auVar184);
          break;
        case 4:
          uVar31 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
          auVar87._0_8_ = uVar31 ^ 0x8000000080000000;
          auVar87._8_4_ = -auVar86._8_4_;
          auVar87._12_4_ = -auVar86._12_4_;
          auVar127._8_4_ = 0x42b0c0a5;
          auVar127._0_8_ = 0x42b0c0a542b0c0a5;
          auVar127._12_4_ = 0x42b0c0a5;
          auVar178 = vminps_avx(auVar87,auVar127);
          auVar128._8_4_ = 0xc2b0c0a5;
          auVar128._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar128._12_4_ = 0xc2b0c0a5;
          auVar90 = vmaxps_avx(auVar178,auVar128);
          auVar129._8_4_ = 0x3fb8aa3b;
          auVar129._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar129._12_4_ = 0x3fb8aa3b;
          auVar241._8_4_ = 0x3f000000;
          auVar241._0_8_ = 0x3f0000003f000000;
          auVar241._12_4_ = 0x3f000000;
          auVar178 = vfmadd213ps_fma(auVar129,auVar90,auVar241);
          auVar185._0_4_ = (int)auVar178._0_4_;
          auVar185._4_4_ = (int)auVar178._4_4_;
          auVar185._8_4_ = (int)auVar178._8_4_;
          auVar185._12_4_ = (int)auVar178._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar185);
          auVar178 = vcmpps_avx(auVar178,auVar214,1);
          auVar178 = vandps_avx(auVar178,auVar122);
          auVar178 = vsubps_avx(auVar214,auVar178);
          auVar66._8_4_ = 0x3f318000;
          auVar66._0_8_ = 0x3f3180003f318000;
          auVar66._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar90,auVar178,auVar66);
          auVar186._8_4_ = 0x395e8083;
          auVar186._0_8_ = 0x395e8083395e8083;
          auVar186._12_4_ = 0x395e8083;
          auVar90 = vfmsub231ps_fma(auVar214,auVar178,auVar186);
          auVar187._0_4_ = auVar90._0_4_ * auVar90._0_4_;
          auVar187._4_4_ = auVar90._4_4_ * auVar90._4_4_;
          auVar187._8_4_ = auVar90._8_4_ * auVar90._8_4_;
          auVar187._12_4_ = auVar90._12_4_ * auVar90._12_4_;
          auVar219._8_4_ = 0x39506967;
          auVar219._0_8_ = 0x3950696739506967;
          auVar219._12_4_ = 0x39506967;
          auVar294._8_4_ = 0x3ab743ce;
          auVar294._0_8_ = 0x3ab743ce3ab743ce;
          auVar294._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar219,auVar90,auVar294);
          auVar280._8_4_ = 0x3c088908;
          auVar280._0_8_ = 0x3c0889083c088908;
          auVar280._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar280);
          auVar67._8_4_ = 0x3d2aa9c1;
          auVar67._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar67._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar67);
          auVar68._8_4_ = 0x3e2aaaaa;
          auVar68._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar68._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar68);
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar241);
          auVar214 = vfmadd213ps_fma(auVar214,auVar187,auVar90);
          auVar188._0_4_ = auVar214._0_4_ + fVar84;
          auVar188._4_4_ = auVar214._4_4_ + fVar120;
          auVar188._8_4_ = auVar214._8_4_ + fVar2;
          auVar188._12_4_ = auVar214._12_4_ + fVar3;
          auVar88._0_4_ = (int)auVar178._0_4_;
          auVar88._4_4_ = (int)auVar178._4_4_;
          auVar88._8_4_ = (int)auVar178._8_4_;
          auVar88._12_4_ = (int)auVar178._12_4_;
          auVar178 = vpslld_avx(auVar88,0x17);
          auVar178 = vpaddd_avx(auVar178,auVar122);
          auVar214 = vfmadd213ps_fma(auVar178,auVar188,auVar122);
          auVar178 = vrcpps_avx(auVar214);
          auVar122 = vfmsub213ps_fma(auVar214,auVar178,auVar122);
          auVar86 = vfnmadd132ps_fma(auVar122,auVar178,auVar178);
          break;
        case 5:
          auVar342._8_4_ = 0x42b0c0a5;
          auVar342._0_8_ = 0x42b0c0a542b0c0a5;
          auVar342._12_4_ = 0x42b0c0a5;
          auVar178 = vminps_avx(auVar342,auVar86);
          auVar350._8_4_ = 0xc2b0c0a5;
          auVar350._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar350._12_4_ = 0xc2b0c0a5;
          auVar90 = vmaxps_avx(auVar350,auVar178);
          auVar357._8_4_ = 0x3fb8aa3b;
          auVar357._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar357._12_4_ = 0x3fb8aa3b;
          auVar240._8_4_ = 0x3f000000;
          auVar240._0_8_ = 0x3f0000003f000000;
          auVar240._12_4_ = 0x3f000000;
          auVar178 = vfmadd213ps_fma(auVar357,auVar90,auVar240);
          auVar211._0_4_ = (int)auVar178._0_4_;
          auVar211._4_4_ = (int)auVar178._4_4_;
          auVar211._8_4_ = (int)auVar178._8_4_;
          auVar211._12_4_ = (int)auVar178._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar211);
          auVar178 = vcmpps_avx(auVar178,auVar214,1);
          auVar178 = vandps_avx(auVar178,auVar122);
          auVar178 = vsubps_avx(auVar214,auVar178);
          auVar343._8_4_ = 0x3f318000;
          auVar343._0_8_ = 0x3f3180003f318000;
          auVar343._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar90,auVar178,auVar343);
          auVar259._8_4_ = 0xb95e8083;
          auVar259._0_8_ = 0xb95e8083b95e8083;
          auVar259._12_4_ = 0xb95e8083;
          auVar90 = vfnmsub231ps_fma(auVar214,auVar178,auVar259);
          auVar212._0_4_ = auVar90._0_4_ * auVar90._0_4_;
          auVar212._4_4_ = auVar90._4_4_ * auVar90._4_4_;
          auVar212._8_4_ = auVar90._8_4_ * auVar90._8_4_;
          auVar212._12_4_ = auVar90._12_4_ * auVar90._12_4_;
          auVar369._8_4_ = 0x39506967;
          auVar369._0_8_ = 0x3950696739506967;
          auVar369._12_4_ = 0x39506967;
          auVar361._8_4_ = 0x3ab743ce;
          auVar361._0_8_ = 0x3ab743ce3ab743ce;
          auVar361._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar369,auVar90,auVar361);
          auVar279._8_4_ = 0x3c088908;
          auVar279._0_8_ = 0x3c0889083c088908;
          auVar279._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar279);
          auVar300._8_4_ = 0x3d2aa9c1;
          auVar300._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar300._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar300);
          auVar301._8_4_ = 0x3e2aaaaa;
          auVar301._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar301._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar301);
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar240);
          auVar214 = vfmadd213ps_fma(auVar214,auVar212,auVar90);
          auVar213._0_4_ = auVar214._0_4_ + fVar84;
          auVar213._4_4_ = auVar214._4_4_ + fVar120;
          auVar213._8_4_ = auVar214._8_4_ + fVar2;
          auVar213._12_4_ = auVar214._12_4_ + fVar3;
          auVar124._0_4_ = (int)auVar178._0_4_;
          auVar124._4_4_ = (int)auVar178._4_4_;
          auVar124._8_4_ = (int)auVar178._8_4_;
          auVar124._12_4_ = (int)auVar178._12_4_;
          auVar178 = vpslld_avx(auVar124,0x17);
          auVar178 = vpaddd_avx(auVar178,auVar122);
          auVar281 = vfmadd213ps_fma(auVar178,auVar213,auVar122);
          auVar179._8_4_ = 0x800000;
          auVar179._0_8_ = 0x80000000800000;
          auVar179._12_4_ = 0x800000;
          auVar178 = vmaxps_avx(auVar281,auVar179);
          auVar214 = vpsrld_avx(auVar178,0x17);
          auVar290._8_4_ = 0xffffff82;
          auVar290._0_8_ = 0xffffff82ffffff82;
          auVar290._12_4_ = 0xffffff82;
          auVar214 = vpaddd_avx(auVar290,auVar214);
          auVar291._8_4_ = 0x807fffff;
          auVar291._0_8_ = 0x807fffff807fffff;
          auVar291._12_4_ = 0x807fffff;
          auVar178 = vandps_avx(auVar291,auVar178);
          auVar260 = vorps_avx(auVar178,auVar240);
          auVar90 = vcvtdq2ps_avx(auVar214);
          auVar292._8_4_ = 0x3f3504f3;
          auVar292._0_8_ = 0x3f3504f33f3504f3;
          auVar292._12_4_ = 0x3f3504f3;
          auVar214 = vcmpps_avx(auVar260,auVar292,1);
          auVar178 = vandps_avx(auVar214,auVar260);
          auVar180._0_4_ = auVar178._0_4_ + auVar260._0_4_ + -1.0;
          auVar180._4_4_ = auVar178._4_4_ + auVar260._4_4_ + -1.0;
          auVar180._8_4_ = auVar178._8_4_ + auVar260._8_4_ + -1.0;
          auVar180._12_4_ = auVar178._12_4_ + auVar260._12_4_ + -1.0;
          auVar178 = vandps_avx(auVar214,auVar122);
          auVar214 = vsubps_avx(auVar90,auVar178);
          auVar293._0_4_ = auVar180._0_4_ * auVar180._0_4_;
          auVar293._4_4_ = auVar180._4_4_ * auVar180._4_4_;
          auVar293._8_4_ = auVar180._8_4_ * auVar180._8_4_;
          auVar293._12_4_ = auVar180._12_4_ * auVar180._12_4_;
          auVar302._8_4_ = 0x3d9021bb;
          auVar302._0_8_ = 0x3d9021bb3d9021bb;
          auVar302._12_4_ = 0x3d9021bb;
          auVar314._8_4_ = 0xbdebd1b8;
          auVar314._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar314._12_4_ = 0xbdebd1b8;
          auVar178 = vfmadd213ps_fma(auVar302,auVar180,auVar314);
          auVar315._8_4_ = 0x3def251a;
          auVar315._0_8_ = 0x3def251a3def251a;
          auVar315._12_4_ = 0x3def251a;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar315);
          auVar316._8_4_ = 0xbdfe5d4f;
          auVar316._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar316._12_4_ = 0xbdfe5d4f;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar316);
          auVar317._8_4_ = 0x3e11e9bf;
          auVar317._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar317._12_4_ = 0x3e11e9bf;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar317);
          auVar318._8_4_ = 0xbe2aae50;
          auVar318._0_8_ = 0xbe2aae50be2aae50;
          auVar318._12_4_ = 0xbe2aae50;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar318);
          auVar319._8_4_ = 0x3e4cceac;
          auVar319._0_8_ = 0x3e4cceac3e4cceac;
          auVar319._12_4_ = 0x3e4cceac;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar319);
          auVar320._8_4_ = 0xbe7ffffc;
          auVar320._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar320._12_4_ = 0xbe7ffffc;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar320);
          auVar321._8_4_ = 0x3eaaaaaa;
          auVar321._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar321._12_4_ = 0x3eaaaaaa;
          auVar178 = vfmadd213ps_fma(auVar178,auVar180,auVar321);
          auVar303._0_4_ = auVar293._0_4_ * auVar180._0_4_ * auVar178._0_4_;
          auVar303._4_4_ = auVar293._4_4_ * auVar180._4_4_ * auVar178._4_4_;
          auVar303._8_4_ = auVar293._8_4_ * auVar180._8_4_ * auVar178._8_4_;
          auVar303._12_4_ = auVar293._12_4_ * auVar180._12_4_ * auVar178._12_4_;
          auVar178 = vfmadd231ps_fma(auVar303,auVar214,auVar259);
          auVar90 = vfmsub231ps_fma(auVar178,auVar240,auVar293);
          auVar178 = vcmpps_avx(auVar281,_DAT_00514070,2);
          auVar90 = vsubps_avx(auVar90,auVar180);
          auVar214 = vfnmadd231ps_fma(auVar90,auVar343,auVar214);
          auVar181._0_4_ = auVar214._0_4_ + auVar214._0_4_;
          auVar181._4_4_ = auVar214._4_4_ + auVar214._4_4_;
          auVar181._8_4_ = auVar214._8_4_ + auVar214._8_4_;
          auVar181._12_4_ = auVar214._12_4_ + auVar214._12_4_;
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar178 = vblendvps_avx(auVar181,auVar215,auVar178);
          auVar182._8_4_ = 0x42b0c0a5;
          auVar182._0_8_ = 0x42b0c0a542b0c0a5;
          auVar182._12_4_ = 0x42b0c0a5;
          auVar178 = vminps_avx(auVar178,auVar182);
          auVar90 = vmaxps_avx(auVar350,auVar178);
          auVar178 = vfmadd213ps_fma(auVar357,auVar90,auVar240);
          auVar216._0_4_ = (int)auVar178._0_4_;
          auVar216._4_4_ = (int)auVar178._4_4_;
          auVar216._8_4_ = (int)auVar178._8_4_;
          auVar216._12_4_ = (int)auVar178._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar216);
          auVar178 = vcmpps_avx(auVar178,auVar214,1);
          auVar178 = vandps_avx(auVar178,auVar122);
          auVar178 = vsubps_avx(auVar214,auVar178);
          auVar214 = vfmsub231ps_fma(auVar90,auVar178,auVar343);
          auVar90 = vfnmsub231ps_fma(auVar214,auVar178,auVar259);
          auVar119 = ZEXT1664(auVar122);
          auVar217._0_4_ = auVar90._0_4_ * auVar90._0_4_;
          auVar217._4_4_ = auVar90._4_4_ * auVar90._4_4_;
          auVar217._8_4_ = auVar90._8_4_ * auVar90._8_4_;
          auVar217._12_4_ = auVar90._12_4_ * auVar90._12_4_;
          auVar214 = vfmadd213ps_fma(auVar369,auVar90,auVar361);
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar279);
          auVar63._8_4_ = 0x3d2aa9c1;
          auVar63._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar63._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar63);
          auVar64._8_4_ = 0x3e2aaaaa;
          auVar64._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar64._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar64);
          auVar214 = vfmadd213ps_fma(auVar214,auVar90,auVar240);
          auVar214 = vfmadd213ps_fma(auVar214,auVar217,auVar90);
          auVar125._0_4_ = auVar214._0_4_ + fVar84;
          auVar125._4_4_ = auVar214._4_4_ + fVar120;
          auVar125._8_4_ = auVar214._8_4_ + fVar2;
          auVar125._12_4_ = auVar214._12_4_ + fVar3;
          auVar183._0_4_ = (int)auVar178._0_4_;
          auVar183._4_4_ = (int)auVar178._4_4_;
          auVar183._8_4_ = (int)auVar178._8_4_;
          auVar183._12_4_ = (int)auVar178._12_4_;
          auVar178 = vpslld_avx(auVar183,0x17);
          auVar178 = vpaddd_avx(auVar178,auVar122);
          auVar178 = vfmadd213ps_fma(auVar178,auVar125,auVar122);
          auVar122 = vrcpps_avx(auVar178);
          auVar218._0_4_ = auVar122._0_4_ + auVar122._0_4_;
          auVar218._4_4_ = auVar122._4_4_ + auVar122._4_4_;
          auVar218._8_4_ = auVar122._8_4_ + auVar122._8_4_;
          auVar218._12_4_ = auVar122._12_4_ + auVar122._12_4_;
          auVar65._8_4_ = 0x40000000;
          auVar65._0_8_ = 0x4000000040000000;
          auVar65._12_4_ = 0x40000000;
          auVar178 = vfmsub213ps_fma(auVar178,auVar218,auVar65);
          auVar122 = vfnmadd213ps_fma(auVar178,auVar122,auVar218);
          auVar86 = vfmsub231ps_fma(auVar86,auVar86,auVar122);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar130._4_4_ = uVar1;
          auVar130._0_4_ = uVar1;
          auVar130._8_4_ = uVar1;
          auVar130._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar189._4_4_ = uVar1;
          auVar189._0_4_ = uVar1;
          auVar189._8_4_ = uVar1;
          auVar189._12_4_ = uVar1;
          auVar178 = vfmadd231ps_fma(auVar189,auVar86,auVar130);
          auVar178 = vmaxps_avx(auVar178,_DAT_00514070);
          auVar122 = vminps_avx(auVar178,auVar122);
          auVar86._0_4_ = auVar122._0_4_ * auVar86._0_4_;
          auVar86._4_4_ = auVar122._4_4_ * auVar86._4_4_;
          auVar86._8_4_ = auVar122._8_4_ * auVar86._8_4_;
          auVar86._12_4_ = auVar122._12_4_ * auVar86._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar44 * 0x10) = auVar86;
        lVar44 = lVar44 + 1;
      } while (lVar44 != iVar51);
    }
    else {
      iVar26 = 0;
      if ((iVar51 != 8) || (iVar51 = top_blob->w, iVar26 = 0, (long)iVar51 < 1)) goto LAB_003068c3;
      p_Var17 = this->_vptr_InnerProduct_x86_fma[-3];
      uVar15 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var17);
      lVar52 = *(long *)(&this->field_0x178 + (long)p_Var17);
      uVar40 = local_3a0 * local_38c;
      lVar44 = 0;
      auVar296._8_4_ = 0x3f000000;
      auVar296._0_8_ = 0x3f0000003f000000;
      auVar296._12_4_ = 0x3f000000;
      auVar296._16_4_ = 0x3f000000;
      auVar296._20_4_ = 0x3f000000;
      auVar296._24_4_ = 0x3f000000;
      auVar296._28_4_ = 0x3f000000;
      auVar264._8_4_ = 0x3f800000;
      auVar264._0_8_ = 0x3f8000003f800000;
      auVar264._12_4_ = 0x3f800000;
      auVar264._16_4_ = 0x3f800000;
      auVar264._20_4_ = 0x3f800000;
      auVar264._24_4_ = 0x3f800000;
      auVar264._28_4_ = 0x3f800000;
      do {
        auVar119 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar52 != 0) {
          auVar119 = ZEXT3264(*(undefined1 (*) [32])(lVar52 + lVar44 * 0x20));
        }
        pauVar49 = (undefined1 (*) [32])
                   ((this->weight_data_tm).w * lVar44 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar35 = (undefined4 *)local_3b8._0_8_;
        if ((int)uVar40 < 8) {
          auVar152 = SUB6432(ZEXT864(0),0);
          auVar78 = SUB6432(ZEXT864(0),0);
          auVar80 = SUB6432(ZEXT864(0),0);
          auVar108 = SUB6432(ZEXT864(0),0);
          auVar210 = ZEXT864(0);
          auVar312 = ZEXT864(0);
          auVar376 = ZEXT864(0);
          uVar27 = 0;
        }
        else {
          auVar376 = ZEXT864(0);
          iVar26 = 7;
          auVar312 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar349 = ZEXT864(0);
          auVar258 = ZEXT864(0);
          auVar356 = ZEXT864(0);
          auVar176 = ZEXT864(0);
          do {
            auVar152 = vlddqu_avx(*pauVar49);
            uVar1 = *puVar35;
            auVar365._4_4_ = uVar1;
            auVar365._0_4_ = uVar1;
            auVar365._8_4_ = uVar1;
            auVar365._12_4_ = uVar1;
            auVar365._16_4_ = uVar1;
            auVar365._20_4_ = uVar1;
            auVar365._24_4_ = uVar1;
            auVar365._28_4_ = uVar1;
            auVar80 = vcvtph2ps_f16c(auVar152._0_16_);
            auVar122 = vfmadd231ps_fma(auVar119._0_32_,auVar365,auVar80);
            auVar119 = ZEXT1664(auVar122);
            uVar1 = puVar35[1];
            auVar323._4_4_ = uVar1;
            auVar323._0_4_ = uVar1;
            auVar323._8_4_ = uVar1;
            auVar323._12_4_ = uVar1;
            auVar323._16_4_ = uVar1;
            auVar323._20_4_ = uVar1;
            auVar323._24_4_ = uVar1;
            auVar323._28_4_ = uVar1;
            auVar80 = vcvtph2ps_f16c(auVar152._16_16_);
            auVar152 = vlddqu_avx(pauVar49[1]);
            uVar1 = puVar35[2];
            auVar283._4_4_ = uVar1;
            auVar283._0_4_ = uVar1;
            auVar283._8_4_ = uVar1;
            auVar283._12_4_ = uVar1;
            auVar283._16_4_ = uVar1;
            auVar283._20_4_ = uVar1;
            auVar283._24_4_ = uVar1;
            auVar283._28_4_ = uVar1;
            auVar122 = vfmadd231ps_fma(auVar376._0_32_,auVar323,auVar80);
            auVar376 = ZEXT1664(auVar122);
            auVar80 = vcvtph2ps_f16c(auVar152._0_16_);
            uVar1 = puVar35[3];
            auVar358._4_4_ = uVar1;
            auVar358._0_4_ = uVar1;
            auVar358._8_4_ = uVar1;
            auVar358._12_4_ = uVar1;
            auVar358._16_4_ = uVar1;
            auVar358._20_4_ = uVar1;
            auVar358._24_4_ = uVar1;
            auVar358._28_4_ = uVar1;
            auVar122 = vfmadd231ps_fma(auVar312._0_32_,auVar283,auVar80);
            auVar312 = ZEXT1664(auVar122);
            auVar152 = vcvtph2ps_f16c(auVar152._16_16_);
            auVar122 = vfmadd231ps_fma(auVar210._0_32_,auVar358,auVar152);
            auVar210 = ZEXT1664(auVar122);
            auVar152 = vlddqu_avx(pauVar49[2]);
            uVar1 = puVar35[4];
            auVar324._4_4_ = uVar1;
            auVar324._0_4_ = uVar1;
            auVar324._8_4_ = uVar1;
            auVar324._12_4_ = uVar1;
            auVar324._16_4_ = uVar1;
            auVar324._20_4_ = uVar1;
            auVar324._24_4_ = uVar1;
            auVar324._28_4_ = uVar1;
            auVar80 = vcvtph2ps_f16c(auVar152._0_16_);
            auVar122 = vfmadd231ps_fma(auVar349._0_32_,auVar324,auVar80);
            auVar349 = ZEXT1664(auVar122);
            auVar108 = ZEXT1632(auVar122);
            uVar1 = puVar35[5];
            auVar325._4_4_ = uVar1;
            auVar325._0_4_ = uVar1;
            auVar325._8_4_ = uVar1;
            auVar325._12_4_ = uVar1;
            auVar325._16_4_ = uVar1;
            auVar325._20_4_ = uVar1;
            auVar325._24_4_ = uVar1;
            auVar325._28_4_ = uVar1;
            auVar80 = vcvtph2ps_f16c(auVar152._16_16_);
            auVar152 = vlddqu_avx(pauVar49[3]);
            uVar1 = puVar35[6];
            auVar366._4_4_ = uVar1;
            auVar366._0_4_ = uVar1;
            auVar366._8_4_ = uVar1;
            auVar366._12_4_ = uVar1;
            auVar366._16_4_ = uVar1;
            auVar366._20_4_ = uVar1;
            auVar366._24_4_ = uVar1;
            auVar366._28_4_ = uVar1;
            auVar122 = vfmadd231ps_fma(auVar258._0_32_,auVar325,auVar80);
            auVar258 = ZEXT1664(auVar122);
            auVar80 = ZEXT1632(auVar122);
            auVar78 = vcvtph2ps_f16c(auVar152._0_16_);
            uVar1 = puVar35[7];
            auVar326._4_4_ = uVar1;
            auVar326._0_4_ = uVar1;
            auVar326._8_4_ = uVar1;
            auVar326._12_4_ = uVar1;
            auVar326._16_4_ = uVar1;
            auVar326._20_4_ = uVar1;
            auVar326._24_4_ = uVar1;
            auVar326._28_4_ = uVar1;
            auVar122 = vfmadd231ps_fma(auVar356._0_32_,auVar366,auVar78);
            auVar356 = ZEXT1664(auVar122);
            auVar78 = ZEXT1632(auVar122);
            auVar152 = vcvtph2ps_f16c(auVar152._16_16_);
            auVar122 = vfmadd231ps_fma(auVar176._0_32_,auVar326,auVar152);
            auVar176 = ZEXT1664(auVar122);
            auVar152 = ZEXT1632(auVar122);
            puVar35 = puVar35 + 8;
            pauVar49 = pauVar49 + 4;
            iVar26 = iVar26 + 8;
            uVar27 = uVar40 & 0xfffffff8;
          } while (iVar26 < (int)uVar40);
        }
        auVar175 = auVar376._0_32_;
        auVar174 = auVar312._0_32_;
        auVar118 = auVar210._0_32_;
        uVar57 = uVar27 | 3;
        while (auVar102 = auVar119._0_32_, (int)uVar57 < (int)uVar40) {
          auVar118 = vlddqu_avx(*pauVar49);
          uVar1 = *puVar35;
          auVar327._4_4_ = uVar1;
          auVar327._0_4_ = uVar1;
          auVar327._8_4_ = uVar1;
          auVar327._12_4_ = uVar1;
          auVar327._16_4_ = uVar1;
          auVar327._20_4_ = uVar1;
          auVar327._24_4_ = uVar1;
          auVar327._28_4_ = uVar1;
          auVar174 = vcvtph2ps_f16c(auVar118._0_16_);
          auVar122 = vfmadd231ps_fma(auVar102,auVar327,auVar174);
          auVar119 = ZEXT1664(auVar122);
          uVar1 = puVar35[1];
          auVar328._4_4_ = uVar1;
          auVar328._0_4_ = uVar1;
          auVar328._8_4_ = uVar1;
          auVar328._12_4_ = uVar1;
          auVar328._16_4_ = uVar1;
          auVar328._20_4_ = uVar1;
          auVar328._24_4_ = uVar1;
          auVar328._28_4_ = uVar1;
          auVar118 = vcvtph2ps_f16c(auVar118._16_16_);
          auVar122 = vfmadd231ps_fma(auVar376._0_32_,auVar328,auVar118);
          auVar376 = ZEXT1664(auVar122);
          auVar175 = ZEXT1632(auVar122);
          auVar118 = vlddqu_avx(pauVar49[1]);
          uVar1 = puVar35[2];
          auVar329._4_4_ = uVar1;
          auVar329._0_4_ = uVar1;
          auVar329._8_4_ = uVar1;
          auVar329._12_4_ = uVar1;
          auVar329._16_4_ = uVar1;
          auVar329._20_4_ = uVar1;
          auVar329._24_4_ = uVar1;
          auVar329._28_4_ = uVar1;
          auVar174 = vcvtph2ps_f16c(auVar118._0_16_);
          auVar122 = vfmadd231ps_fma(auVar312._0_32_,auVar329,auVar174);
          auVar312 = ZEXT1664(auVar122);
          auVar174 = ZEXT1632(auVar122);
          uVar1 = puVar35[3];
          auVar330._4_4_ = uVar1;
          auVar330._0_4_ = uVar1;
          auVar330._8_4_ = uVar1;
          auVar330._12_4_ = uVar1;
          auVar330._16_4_ = uVar1;
          auVar330._20_4_ = uVar1;
          auVar330._24_4_ = uVar1;
          auVar330._28_4_ = uVar1;
          auVar118 = vcvtph2ps_f16c(auVar118._16_16_);
          auVar122 = vfmadd231ps_fma(auVar210._0_32_,auVar330,auVar118);
          auVar210 = ZEXT1664(auVar122);
          auVar118 = ZEXT1632(auVar122);
          puVar35 = puVar35 + 4;
          pauVar49 = pauVar49 + 2;
          uVar57 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if (uVar40 - uVar27 != 0 && (int)uVar27 <= (int)uVar40) {
          lVar59 = 0;
          do {
            uVar1 = puVar35[lVar59];
            auVar284._4_4_ = uVar1;
            auVar284._0_4_ = uVar1;
            auVar284._8_4_ = uVar1;
            auVar284._12_4_ = uVar1;
            auVar284._16_4_ = uVar1;
            auVar284._20_4_ = uVar1;
            auVar284._24_4_ = uVar1;
            auVar284._28_4_ = uVar1;
            auVar122 = vlddqu_avx(*(undefined1 (*) [16])*pauVar49);
            auVar102 = vcvtph2ps_f16c(auVar122);
            auVar122 = vfmadd231ps_fma(auVar119._0_32_,auVar284,auVar102);
            auVar119 = ZEXT1664(auVar122);
            auVar102 = ZEXT1632(auVar122);
            pauVar49 = (undefined1 (*) [32])(*pauVar49 + 0x10);
            lVar59 = lVar59 + 1;
          } while (uVar40 - uVar27 != (int)lVar59);
        }
        fVar84 = auVar78._0_4_ + auVar152._0_4_ + auVar108._0_4_ + auVar80._0_4_ +
                 auVar175._0_4_ + auVar174._0_4_ + auVar118._0_4_ + auVar102._0_4_;
        fVar120 = auVar78._4_4_ + auVar152._4_4_ + auVar108._4_4_ + auVar80._4_4_ +
                  auVar175._4_4_ + auVar174._4_4_ + auVar118._4_4_ + auVar102._4_4_;
        auVar103._0_8_ = CONCAT44(fVar120,fVar84);
        auVar103._8_4_ =
             auVar78._8_4_ + auVar152._8_4_ + auVar108._8_4_ + auVar80._8_4_ +
             auVar175._8_4_ + auVar174._8_4_ + auVar118._8_4_ + auVar102._8_4_;
        auVar103._12_4_ =
             auVar78._12_4_ + auVar152._12_4_ + auVar108._12_4_ + auVar80._12_4_ +
             auVar175._12_4_ + auVar174._12_4_ + auVar118._12_4_ + auVar102._12_4_;
        auVar103._16_4_ =
             auVar78._16_4_ + auVar152._16_4_ + auVar108._16_4_ + auVar80._16_4_ +
             auVar175._16_4_ + auVar174._16_4_ + auVar118._16_4_ + auVar102._16_4_;
        auVar103._20_4_ =
             auVar78._20_4_ + auVar152._20_4_ + auVar108._20_4_ + auVar80._20_4_ +
             auVar175._20_4_ + auVar174._20_4_ + auVar118._20_4_ + auVar102._20_4_;
        auVar103._24_4_ =
             auVar78._24_4_ + auVar152._24_4_ + auVar108._24_4_ + auVar80._24_4_ +
             auVar175._24_4_ + auVar174._24_4_ + auVar118._24_4_ + auVar102._24_4_;
        auVar103._28_4_ =
             auVar78._28_4_ + auVar152._28_4_ + auVar108._28_4_ + auVar80._28_4_ +
             auVar175._28_4_ + auVar174._28_4_ + auVar118._28_4_ + auVar102._28_4_;
        switch(uVar15) {
        case 1:
          auVar103 = vmaxps_avx(auVar103,_DAT_005191a0);
          break;
        case 2:
          auVar152 = vmaxps_avx(auVar103,ZEXT1632(ZEXT816(0) << 0x40));
          auVar80 = vminps_avx(auVar103,ZEXT1632(ZEXT816(0) << 0x40));
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar107._4_4_ = uVar1;
          auVar107._0_4_ = uVar1;
          auVar107._8_4_ = uVar1;
          auVar107._12_4_ = uVar1;
          auVar107._16_4_ = uVar1;
          auVar107._20_4_ = uVar1;
          auVar107._24_4_ = uVar1;
          auVar107._28_4_ = uVar1;
          auVar122 = vfmadd213ps_fma(auVar107,auVar80,auVar152);
          auVar103 = ZEXT1632(auVar122);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar157._4_4_ = uVar1;
          auVar157._0_4_ = uVar1;
          auVar157._8_4_ = uVar1;
          auVar157._12_4_ = uVar1;
          auVar157._16_4_ = uVar1;
          auVar157._20_4_ = uVar1;
          auVar157._24_4_ = uVar1;
          auVar157._28_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar202._4_4_ = uVar1;
          auVar202._0_4_ = uVar1;
          auVar202._8_4_ = uVar1;
          auVar202._12_4_ = uVar1;
          auVar202._16_4_ = uVar1;
          auVar202._20_4_ = uVar1;
          auVar202._24_4_ = uVar1;
          auVar202._28_4_ = uVar1;
          auVar152 = vmaxps_avx(auVar103,auVar157);
          auVar103 = vminps_avx(auVar152,auVar202);
          break;
        case 4:
          auVar104._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
          auVar104._8_4_ = -auVar103._8_4_;
          auVar104._12_4_ = -auVar103._12_4_;
          auVar104._16_4_ = -auVar103._16_4_;
          auVar104._20_4_ = -auVar103._20_4_;
          auVar104._24_4_ = -auVar103._24_4_;
          auVar104._28_4_ = -auVar103._28_4_;
          auVar158._8_4_ = 0x42b0c0a5;
          auVar158._0_8_ = 0x42b0c0a542b0c0a5;
          auVar158._12_4_ = 0x42b0c0a5;
          auVar158._16_4_ = 0x42b0c0a5;
          auVar158._20_4_ = 0x42b0c0a5;
          auVar158._24_4_ = 0x42b0c0a5;
          auVar158._28_4_ = 0x42b0c0a5;
          auVar152 = vminps_avx(auVar104,auVar158);
          auVar159._8_4_ = 0xc2b0c0a5;
          auVar159._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar159._12_4_ = 0xc2b0c0a5;
          auVar159._16_4_ = 0xc2b0c0a5;
          auVar159._20_4_ = 0xc2b0c0a5;
          auVar159._24_4_ = 0xc2b0c0a5;
          auVar159._28_4_ = 0xc2b0c0a5;
          auVar80 = vmaxps_avx(auVar152,auVar159);
          auVar160._8_4_ = 0x3fb8aa3b;
          auVar160._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar160._12_4_ = 0x3fb8aa3b;
          auVar160._16_4_ = 0x3fb8aa3b;
          auVar160._20_4_ = 0x3fb8aa3b;
          auVar160._24_4_ = 0x3fb8aa3b;
          auVar160._28_4_ = 0x3fb8aa3b;
          auVar122 = vfmadd213ps_fma(auVar160,auVar80,auVar296);
          auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
          auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
          auVar152 = vandps_avx(auVar152,auVar264);
          auVar152 = vsubps_avx(auVar108,auVar152);
          auVar203._8_4_ = 0x3f318000;
          auVar203._0_8_ = 0x3f3180003f318000;
          auVar203._12_4_ = 0x3f318000;
          auVar203._16_4_ = 0x3f318000;
          auVar203._20_4_ = 0x3f318000;
          auVar203._24_4_ = 0x3f318000;
          auVar203._28_4_ = 0x3f318000;
          auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar203);
          auVar204._8_4_ = 0x395e8083;
          auVar204._0_8_ = 0x395e8083395e8083;
          auVar204._12_4_ = 0x395e8083;
          auVar204._16_4_ = 0x395e8083;
          auVar204._20_4_ = 0x395e8083;
          auVar204._24_4_ = 0x395e8083;
          auVar204._28_4_ = 0x395e8083;
          auVar178 = vfmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar204);
          auVar80 = ZEXT1632(auVar178);
          auVar23._28_4_ = 0x395e8083;
          auVar23._0_28_ =
               ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                  CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                           CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                    auVar178._0_4_ * auVar178._0_4_))));
          auVar249._8_4_ = 0x39506967;
          auVar249._0_8_ = 0x3950696739506967;
          auVar249._12_4_ = 0x39506967;
          auVar249._16_4_ = 0x39506967;
          auVar249._20_4_ = 0x39506967;
          auVar249._24_4_ = 0x39506967;
          auVar249._28_4_ = 0x39506967;
          auVar288._8_4_ = 0x3ab743ce;
          auVar288._0_8_ = 0x3ab743ce3ab743ce;
          auVar288._12_4_ = 0x3ab743ce;
          auVar288._16_4_ = 0x3ab743ce;
          auVar288._20_4_ = 0x3ab743ce;
          auVar288._24_4_ = 0x3ab743ce;
          auVar288._28_4_ = 0x3ab743ce;
          auVar122 = vfmadd213ps_fma(auVar249,auVar80,auVar288);
          auVar235._8_4_ = 0x3c088908;
          auVar235._0_8_ = 0x3c0889083c088908;
          auVar235._12_4_ = 0x3c088908;
          auVar235._16_4_ = 0x3c088908;
          auVar235._20_4_ = 0x3c088908;
          auVar235._24_4_ = 0x3c088908;
          auVar235._28_4_ = 0x3c088908;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar235);
          auVar76._8_4_ = 0x3d2aa9c1;
          auVar76._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar76._12_4_ = 0x3d2aa9c1;
          auVar76._16_4_ = 0x3d2aa9c1;
          auVar76._20_4_ = 0x3d2aa9c1;
          auVar76._24_4_ = 0x3d2aa9c1;
          auVar76._28_4_ = 0x3d2aa9c1;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar76);
          auVar77._8_4_ = 0x3e2aaaaa;
          auVar77._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar77._12_4_ = 0x3e2aaaaa;
          auVar77._16_4_ = 0x3e2aaaaa;
          auVar77._20_4_ = 0x3e2aaaaa;
          auVar77._24_4_ = 0x3e2aaaaa;
          auVar77._28_4_ = 0x3e2aaaaa;
          auVar80 = ZEXT1632(auVar178);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar77);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar296);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar23,auVar80);
          auVar85._0_4_ = (int)auVar152._0_4_;
          auVar85._4_4_ = (int)auVar152._4_4_;
          auVar85._8_4_ = (int)auVar152._8_4_;
          auVar85._12_4_ = (int)auVar152._12_4_;
          auVar105._16_4_ = (int)auVar152._16_4_;
          auVar105._0_16_ = auVar85;
          auVar105._20_4_ = (int)auVar152._20_4_;
          auVar105._24_4_ = (int)auVar152._24_4_;
          auVar105._28_4_ = (int)auVar152._28_4_;
          auVar178 = vpslld_avx(auVar85,0x17);
          auVar122 = vpslld_avx(auVar105._16_16_,0x17);
          auVar62._8_4_ = 0x3f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._12_4_ = 0x3f800000;
          auVar122 = vpaddd_avx(auVar122,auVar62);
          auVar178 = vpaddd_avx(auVar178,auVar62);
          auVar106._16_16_ = auVar122;
          auVar106._0_16_ = auVar178;
          auVar161._0_4_ = auVar214._0_4_ + 1.0;
          auVar161._4_4_ = auVar214._4_4_ + 1.0;
          auVar161._8_4_ = auVar214._8_4_ + 1.0;
          auVar161._12_4_ = auVar214._12_4_ + 1.0;
          auVar161._16_4_ = 0x3f800000;
          auVar161._20_4_ = 0x3f800000;
          auVar161._24_4_ = 0x3f800000;
          auVar161._28_4_ = 0x3f800000;
          auVar122 = vfmadd213ps_fma(auVar106,auVar161,auVar264);
          auVar152 = vrcpps_avx(ZEXT1632(auVar122));
          auVar122 = vfmsub213ps_fma(ZEXT1632(auVar122),auVar152,auVar264);
          auVar122 = vfnmadd132ps_fma(ZEXT1632(auVar122),auVar152,auVar152);
          auVar103 = ZEXT1632(auVar122);
          break;
        case 5:
          auVar345._8_4_ = 0x42b0c0a5;
          auVar345._0_8_ = 0x42b0c0a542b0c0a5;
          auVar345._12_4_ = 0x42b0c0a5;
          auVar345._16_4_ = 0x42b0c0a5;
          auVar345._20_4_ = 0x42b0c0a5;
          auVar345._24_4_ = 0x42b0c0a5;
          auVar345._28_4_ = 0x42b0c0a5;
          auVar152 = vminps_avx(auVar345,auVar103);
          auVar352._8_4_ = 0xc2b0c0a5;
          auVar352._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar352._12_4_ = 0xc2b0c0a5;
          auVar352._16_4_ = 0xc2b0c0a5;
          auVar352._20_4_ = 0xc2b0c0a5;
          auVar352._24_4_ = 0xc2b0c0a5;
          auVar352._28_4_ = 0xc2b0c0a5;
          auVar80 = vmaxps_avx(auVar352,auVar152);
          auVar194._8_4_ = 0x3fb8aa3b;
          auVar194._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar194._12_4_ = 0x3fb8aa3b;
          auVar194._16_4_ = 0x3fb8aa3b;
          auVar194._20_4_ = 0x3fb8aa3b;
          auVar194._24_4_ = 0x3fb8aa3b;
          auVar194._28_4_ = 0x3fb8aa3b;
          auVar122 = vfmadd213ps_fma(auVar194,auVar80,auVar296);
          auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
          auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
          auVar152 = vandps_avx(auVar152,auVar264);
          auVar152 = vsubps_avx(auVar108,auVar152);
          auVar367._8_4_ = 0x3f318000;
          auVar367._0_8_ = 0x3f3180003f318000;
          auVar367._12_4_ = 0x3f318000;
          auVar367._16_4_ = 0x3f318000;
          auVar367._20_4_ = 0x3f318000;
          auVar367._24_4_ = 0x3f318000;
          auVar367._28_4_ = 0x3f318000;
          auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar367);
          auVar353._8_4_ = 0xb95e8083;
          auVar353._0_8_ = 0xb95e8083b95e8083;
          auVar353._12_4_ = 0xb95e8083;
          auVar353._16_4_ = 0xb95e8083;
          auVar353._20_4_ = 0xb95e8083;
          auVar353._24_4_ = 0xb95e8083;
          auVar353._28_4_ = 0xb95e8083;
          auVar178 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar353);
          auVar80 = ZEXT1632(auVar178);
          auVar21._28_4_ = auVar108._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                  CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                           CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                    auVar178._0_4_ * auVar178._0_4_))));
          auVar285._8_4_ = 0x39506967;
          auVar285._0_8_ = 0x3950696739506967;
          auVar285._12_4_ = 0x39506967;
          auVar285._16_4_ = 0x39506967;
          auVar285._20_4_ = 0x39506967;
          auVar285._24_4_ = 0x39506967;
          auVar285._28_4_ = 0x39506967;
          auVar373._8_4_ = 0x3ab743ce;
          auVar373._0_8_ = 0x3ab743ce3ab743ce;
          auVar373._12_4_ = 0x3ab743ce;
          auVar373._16_4_ = 0x3ab743ce;
          auVar373._20_4_ = 0x3ab743ce;
          auVar373._24_4_ = 0x3ab743ce;
          auVar373._28_4_ = 0x3ab743ce;
          auVar122 = vfmadd213ps_fma(auVar285,auVar80,auVar373);
          auVar374._8_4_ = 0x3c088908;
          auVar374._0_8_ = 0x3c0889083c088908;
          auVar374._12_4_ = 0x3c088908;
          auVar374._16_4_ = 0x3c088908;
          auVar374._20_4_ = 0x3c088908;
          auVar374._24_4_ = 0x3c088908;
          auVar374._28_4_ = 0x3c088908;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar374);
          auVar359._8_4_ = 0x3d2aa9c1;
          auVar359._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar359._12_4_ = 0x3d2aa9c1;
          auVar359._16_4_ = 0x3d2aa9c1;
          auVar359._20_4_ = 0x3d2aa9c1;
          auVar359._24_4_ = 0x3d2aa9c1;
          auVar359._28_4_ = 0x3d2aa9c1;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar359);
          auVar346._8_4_ = 0x3e2aaaaa;
          auVar346._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar346._12_4_ = 0x3e2aaaaa;
          auVar346._16_4_ = 0x3e2aaaaa;
          auVar346._20_4_ = 0x3e2aaaaa;
          auVar346._24_4_ = 0x3e2aaaaa;
          auVar346._28_4_ = 0x3e2aaaaa;
          auVar80 = ZEXT1632(auVar178);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar346);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar296);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar21,auVar80);
          auVar246._0_4_ = auVar122._0_4_ + 1.0;
          auVar246._4_4_ = auVar122._4_4_ + 1.0;
          auVar246._8_4_ = auVar122._8_4_ + 1.0;
          auVar246._12_4_ = auVar122._12_4_ + 1.0;
          auVar246._16_4_ = 0x3f800000;
          auVar246._20_4_ = 0x3f800000;
          auVar246._24_4_ = 0x3f800000;
          auVar246._28_4_ = 0x3f800000;
          auVar121._0_4_ = (int)auVar152._0_4_;
          auVar121._4_4_ = (int)auVar152._4_4_;
          auVar121._8_4_ = (int)auVar152._8_4_;
          auVar121._12_4_ = (int)auVar152._12_4_;
          auVar153._16_4_ = (int)auVar152._16_4_;
          auVar153._0_16_ = auVar121;
          auVar153._20_4_ = (int)auVar152._20_4_;
          auVar153._24_4_ = (int)auVar152._24_4_;
          auVar153._28_4_ = (int)auVar152._28_4_;
          auVar178 = vpslld_avx(auVar121,0x17);
          auVar122 = vpslld_avx(auVar153._16_16_,0x17);
          auVar61._8_4_ = 0x3f800000;
          auVar61._0_8_ = 0x3f8000003f800000;
          auVar61._12_4_ = 0x3f800000;
          auVar122 = vpaddd_avx(auVar122,auVar61);
          auVar178 = vpaddd_avx(auVar178,auVar61);
          auVar154._16_16_ = auVar122;
          auVar154._0_16_ = auVar178;
          auVar214 = vfmadd213ps_fma(auVar154,auVar246,auVar264);
          auVar195._8_4_ = 0x800000;
          auVar195._0_8_ = 0x80000000800000;
          auVar195._12_4_ = 0x800000;
          auVar195._16_4_ = 0x800000;
          auVar195._20_4_ = 0x800000;
          auVar195._24_4_ = 0x800000;
          auVar195._28_4_ = 0x800000;
          auVar152 = vmaxps_avx(ZEXT1632(auVar214),auVar195);
          auVar178 = vpsrld_avx(auVar152._0_16_,0x17);
          auVar122 = vpsrld_avx(auVar152._16_16_,0x17);
          auVar304._8_4_ = 0x807fffff;
          auVar304._0_8_ = 0x807fffff807fffff;
          auVar304._12_4_ = 0x807fffff;
          auVar304._16_4_ = 0x807fffff;
          auVar304._20_4_ = 0x807fffff;
          auVar304._24_4_ = 0x807fffff;
          auVar304._28_4_ = 0x807fffff;
          auVar152 = vandps_avx(auVar304,auVar152);
          auVar108 = vorps_avx(auVar296,auVar152);
          auVar305._8_4_ = 0x3f3504f3;
          auVar305._0_8_ = 0x3f3504f33f3504f3;
          auVar305._12_4_ = 0x3f3504f3;
          auVar305._16_4_ = 0x3f3504f3;
          auVar305._20_4_ = 0x3f3504f3;
          auVar305._24_4_ = 0x3f3504f3;
          auVar305._28_4_ = 0x3f3504f3;
          auVar80 = vcmpps_avx(auVar305,auVar108,2);
          auVar152 = vandnps_avx(auVar80,auVar108);
          auVar234._8_4_ = 0xbf800000;
          auVar234._0_8_ = 0xbf800000bf800000;
          auVar234._12_4_ = 0xbf800000;
          auVar234._16_4_ = 0xbf800000;
          auVar234._20_4_ = 0xbf800000;
          auVar234._24_4_ = 0xbf800000;
          auVar234._28_4_ = 0xbf800000;
          auVar196._0_4_ = auVar152._0_4_ + auVar108._0_4_ + -1.0;
          auVar196._4_4_ = auVar152._4_4_ + auVar108._4_4_ + -1.0;
          auVar196._8_4_ = auVar152._8_4_ + auVar108._8_4_ + -1.0;
          auVar196._12_4_ = auVar152._12_4_ + auVar108._12_4_ + -1.0;
          auVar196._16_4_ = auVar152._16_4_ + auVar108._16_4_ + -1.0;
          auVar196._20_4_ = auVar152._20_4_ + auVar108._20_4_ + -1.0;
          auVar196._24_4_ = auVar152._24_4_ + auVar108._24_4_ + -1.0;
          auVar196._28_4_ = auVar152._28_4_ + auVar108._28_4_ + -1.0;
          auVar122 = vpsubd_avx(auVar122,auVar80._16_16_);
          auVar313._8_4_ = 0xffffff81;
          auVar313._0_8_ = 0xffffff81ffffff81;
          auVar313._12_4_ = 0xffffff81;
          auVar122 = vpaddd_avx(auVar313,auVar122);
          auVar178 = vpsubd_avx(auVar178,auVar80._0_16_);
          auVar178 = vpaddd_avx(auVar313,auVar178);
          auVar247._16_16_ = auVar122;
          auVar247._0_16_ = auVar178;
          auVar286._0_4_ = auVar196._0_4_ * auVar196._0_4_;
          auVar286._4_4_ = auVar196._4_4_ * auVar196._4_4_;
          auVar286._8_4_ = auVar196._8_4_ * auVar196._8_4_;
          auVar286._12_4_ = auVar196._12_4_ * auVar196._12_4_;
          auVar286._16_4_ = auVar196._16_4_ * auVar196._16_4_;
          auVar286._20_4_ = auVar196._20_4_ * auVar196._20_4_;
          auVar286._24_4_ = auVar196._24_4_ * auVar196._24_4_;
          auVar286._28_4_ = 0;
          auVar306._8_4_ = 0x3d9021bb;
          auVar306._0_8_ = 0x3d9021bb3d9021bb;
          auVar306._12_4_ = 0x3d9021bb;
          auVar306._16_4_ = 0x3d9021bb;
          auVar306._20_4_ = 0x3d9021bb;
          auVar306._24_4_ = 0x3d9021bb;
          auVar306._28_4_ = 0x3d9021bb;
          auVar331._8_4_ = 0xbdebd1b8;
          auVar331._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar331._12_4_ = 0xbdebd1b8;
          auVar331._16_4_ = 0xbdebd1b8;
          auVar331._20_4_ = 0xbdebd1b8;
          auVar331._24_4_ = 0xbdebd1b8;
          auVar331._28_4_ = 0xbdebd1b8;
          auVar122 = vfmadd213ps_fma(auVar306,auVar196,auVar331);
          auVar332._8_4_ = 0x3def251a;
          auVar332._0_8_ = 0x3def251a3def251a;
          auVar332._12_4_ = 0x3def251a;
          auVar332._16_4_ = 0x3def251a;
          auVar332._20_4_ = 0x3def251a;
          auVar332._24_4_ = 0x3def251a;
          auVar332._28_4_ = 0x3def251a;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar332);
          auVar333._8_4_ = 0xbdfe5d4f;
          auVar333._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar333._12_4_ = 0xbdfe5d4f;
          auVar333._16_4_ = 0xbdfe5d4f;
          auVar333._20_4_ = 0xbdfe5d4f;
          auVar333._24_4_ = 0xbdfe5d4f;
          auVar333._28_4_ = 0xbdfe5d4f;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar333);
          auVar334._8_4_ = 0x3e11e9bf;
          auVar334._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar334._12_4_ = 0x3e11e9bf;
          auVar334._16_4_ = 0x3e11e9bf;
          auVar334._20_4_ = 0x3e11e9bf;
          auVar334._24_4_ = 0x3e11e9bf;
          auVar334._28_4_ = 0x3e11e9bf;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar334);
          auVar335._8_4_ = 0xbe2aae50;
          auVar335._0_8_ = 0xbe2aae50be2aae50;
          auVar335._12_4_ = 0xbe2aae50;
          auVar335._16_4_ = 0xbe2aae50;
          auVar335._20_4_ = 0xbe2aae50;
          auVar335._24_4_ = 0xbe2aae50;
          auVar335._28_4_ = 0xbe2aae50;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar335);
          auVar336._8_4_ = 0x3e4cceac;
          auVar336._0_8_ = 0x3e4cceac3e4cceac;
          auVar336._12_4_ = 0x3e4cceac;
          auVar336._16_4_ = 0x3e4cceac;
          auVar336._20_4_ = 0x3e4cceac;
          auVar336._24_4_ = 0x3e4cceac;
          auVar336._28_4_ = 0x3e4cceac;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar336);
          auVar337._8_4_ = 0xbe7ffffc;
          auVar337._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar337._12_4_ = 0xbe7ffffc;
          auVar337._16_4_ = 0xbe7ffffc;
          auVar337._20_4_ = 0xbe7ffffc;
          auVar337._24_4_ = 0xbe7ffffc;
          auVar337._28_4_ = 0xbe7ffffc;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar337);
          auVar338._8_4_ = 0x3eaaaaaa;
          auVar338._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar338._12_4_ = 0x3eaaaaaa;
          auVar338._16_4_ = 0x3eaaaaaa;
          auVar338._20_4_ = 0x3eaaaaaa;
          auVar338._24_4_ = 0x3eaaaaaa;
          auVar338._28_4_ = 0x3eaaaaaa;
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar196,auVar338);
          auVar307._0_4_ = auVar286._0_4_ * auVar196._0_4_ * auVar122._0_4_;
          auVar307._4_4_ = auVar286._4_4_ * auVar196._4_4_ * auVar122._4_4_;
          auVar307._8_4_ = auVar286._8_4_ * auVar196._8_4_ * auVar122._8_4_;
          auVar307._12_4_ = auVar286._12_4_ * auVar196._12_4_ * auVar122._12_4_;
          auVar307._16_4_ = auVar286._16_4_ * auVar196._16_4_ * 0.0;
          auVar307._20_4_ = auVar286._20_4_ * auVar196._20_4_ * 0.0;
          auVar307._24_4_ = auVar286._24_4_ * auVar196._24_4_ * 0.0;
          auVar307._28_4_ = 0;
          auVar80 = vcvtdq2ps_avx(auVar247);
          auVar122 = vfmadd231ps_fma(auVar307,auVar80,auVar353);
          auVar122 = vfmsub231ps_fma(ZEXT1632(auVar122),auVar296,auVar286);
          auVar152 = vcmpps_avx(ZEXT1632(auVar214),_DAT_005191a0,2);
          auVar108 = vsubps_avx(ZEXT1632(auVar122),auVar196);
          auVar122 = vfmsub231ps_fma(auVar108,auVar367,auVar80);
          auVar308._8_4_ = 0xc0000000;
          auVar308._0_8_ = 0xc0000000c0000000;
          auVar308._12_4_ = 0xc0000000;
          auVar308._16_4_ = 0xc0000000;
          auVar308._20_4_ = 0xc0000000;
          auVar308._24_4_ = 0xc0000000;
          auVar308._28_4_ = 0xc0000000;
          auVar197._0_4_ = auVar122._0_4_ * -2.0;
          auVar197._4_4_ = auVar122._4_4_ * -2.0;
          auVar197._8_4_ = auVar122._8_4_ * -2.0;
          auVar197._12_4_ = auVar122._12_4_ * -2.0;
          auVar197._16_4_ = 0x80000000;
          auVar197._20_4_ = 0x80000000;
          auVar197._24_4_ = 0x80000000;
          auVar197._28_4_ = 0;
          auVar248._8_4_ = 0x7fffffff;
          auVar248._0_8_ = 0x7fffffff7fffffff;
          auVar248._12_4_ = 0x7fffffff;
          auVar248._16_4_ = 0x7fffffff;
          auVar248._20_4_ = 0x7fffffff;
          auVar248._24_4_ = 0x7fffffff;
          auVar248._28_4_ = 0x7fffffff;
          auVar152 = vblendvps_avx(auVar197,auVar248,auVar152);
          auVar198._8_4_ = 0x42b0c0a5;
          auVar198._0_8_ = 0x42b0c0a542b0c0a5;
          auVar198._12_4_ = 0x42b0c0a5;
          auVar198._16_4_ = 0x42b0c0a5;
          auVar198._20_4_ = 0x42b0c0a5;
          auVar198._24_4_ = 0x42b0c0a5;
          auVar198._28_4_ = 0x42b0c0a5;
          auVar152 = vminps_avx(auVar152,auVar198);
          auVar199._8_4_ = 0xc2b0c0a5;
          auVar199._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar199._12_4_ = 0xc2b0c0a5;
          auVar199._16_4_ = 0xc2b0c0a5;
          auVar199._20_4_ = 0xc2b0c0a5;
          auVar199._24_4_ = 0xc2b0c0a5;
          auVar199._28_4_ = 0xc2b0c0a5;
          auVar80 = vmaxps_avx(auVar152,auVar199);
          auVar200._8_4_ = 0x3fb8aa3b;
          auVar200._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar200._12_4_ = 0x3fb8aa3b;
          auVar200._16_4_ = 0x3fb8aa3b;
          auVar200._20_4_ = 0x3fb8aa3b;
          auVar200._24_4_ = 0x3fb8aa3b;
          auVar200._28_4_ = 0x3fb8aa3b;
          auVar122 = vfmadd213ps_fma(auVar200,auVar80,auVar296);
          auVar108 = vroundps_avx(ZEXT1632(auVar122),1);
          auVar152 = vcmpps_avx(ZEXT1632(auVar122),auVar108,1);
          auVar152 = vandps_avx(auVar152,auVar264);
          auVar152 = vsubps_avx(auVar108,auVar152);
          auVar122 = vfmsub231ps_fma(auVar80,auVar152,auVar367);
          auVar178 = vfnmsub231ps_fma(ZEXT1632(auVar122),auVar152,auVar353);
          auVar80 = ZEXT1632(auVar178);
          auVar22._28_4_ = auVar108._28_4_;
          auVar22._0_28_ =
               ZEXT1628(CONCAT412(auVar178._12_4_ * auVar178._12_4_,
                                  CONCAT48(auVar178._8_4_ * auVar178._8_4_,
                                           CONCAT44(auVar178._4_4_ * auVar178._4_4_,
                                                    auVar178._0_4_ * auVar178._0_4_))));
          auVar287._8_4_ = 0x39506967;
          auVar287._0_8_ = 0x3950696739506967;
          auVar287._12_4_ = 0x39506967;
          auVar287._16_4_ = 0x39506967;
          auVar287._20_4_ = 0x39506967;
          auVar287._24_4_ = 0x39506967;
          auVar287._28_4_ = 0x39506967;
          auVar339._8_4_ = 0x3ab743ce;
          auVar339._0_8_ = 0x3ab743ce3ab743ce;
          auVar339._12_4_ = 0x3ab743ce;
          auVar339._16_4_ = 0x3ab743ce;
          auVar339._20_4_ = 0x3ab743ce;
          auVar339._24_4_ = 0x3ab743ce;
          auVar339._28_4_ = 0x3ab743ce;
          auVar122 = vfmadd213ps_fma(auVar287,auVar80,auVar339);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar374);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar359);
          auVar80 = ZEXT1632(auVar178);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar346);
          auVar122 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar80,auVar296);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar122),auVar22,auVar80);
          auVar123._0_4_ = (int)auVar152._0_4_;
          auVar123._4_4_ = (int)auVar152._4_4_;
          auVar123._8_4_ = (int)auVar152._8_4_;
          auVar123._12_4_ = (int)auVar152._12_4_;
          auVar155._16_4_ = (int)auVar152._16_4_;
          auVar155._0_16_ = auVar123;
          auVar155._20_4_ = (int)auVar152._20_4_;
          auVar155._24_4_ = (int)auVar152._24_4_;
          auVar155._28_4_ = (int)auVar152._28_4_;
          auVar178 = vpslld_avx(auVar123,0x17);
          auVar122 = vpslld_avx(auVar155._16_16_,0x17);
          auVar122 = vpaddd_avx(auVar122,auVar61);
          auVar178 = vpaddd_avx(auVar178,auVar61);
          auVar156._16_16_ = auVar122;
          auVar156._0_16_ = auVar178;
          auVar201._0_4_ = auVar214._0_4_ + 1.0;
          auVar201._4_4_ = auVar214._4_4_ + 1.0;
          auVar201._8_4_ = auVar214._8_4_ + 1.0;
          auVar201._12_4_ = auVar214._12_4_ + 1.0;
          auVar201._16_4_ = 0x3f800000;
          auVar201._20_4_ = 0x3f800000;
          auVar201._24_4_ = 0x3f800000;
          auVar201._28_4_ = 0x3f800000;
          auVar122 = vfmadd213ps_fma(auVar156,auVar201,auVar264);
          auVar152 = vrcpps_avx(ZEXT1632(auVar122));
          auVar122 = vfmsub213ps_fma(ZEXT1632(auVar122),auVar152,auVar264);
          auVar122 = vfnmadd132ps_fma(ZEXT1632(auVar122),auVar152,auVar152);
          auVar122 = vfnmadd213ps_fma(ZEXT1632(auVar122),auVar308,auVar234);
          auVar151 = ZEXT1628(auVar122);
          goto LAB_00304bb9;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var17);
          auVar162._4_4_ = uVar1;
          auVar162._0_4_ = uVar1;
          auVar162._8_4_ = uVar1;
          auVar162._12_4_ = uVar1;
          auVar162._16_4_ = uVar1;
          auVar162._20_4_ = uVar1;
          auVar162._24_4_ = uVar1;
          auVar162._28_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var17))[1];
          auVar205._4_4_ = uVar1;
          auVar205._0_4_ = uVar1;
          auVar205._8_4_ = uVar1;
          auVar205._12_4_ = uVar1;
          auVar205._16_4_ = uVar1;
          auVar205._20_4_ = uVar1;
          auVar205._24_4_ = uVar1;
          auVar205._28_4_ = uVar1;
          auVar122 = vfmadd231ps_fma(auVar205,auVar103,auVar162);
          auVar152 = vmaxps_avx(ZEXT1632(auVar122),_DAT_005191a0);
          auVar152 = vminps_avx(auVar152,auVar264);
          auVar151 = auVar152._0_28_;
LAB_00304bb9:
          auVar103._4_4_ = auVar151._4_4_ * fVar120;
          auVar103._0_4_ = auVar151._0_4_ * fVar84;
          auVar103._8_4_ = auVar151._8_4_ * auVar103._8_4_;
          auVar103._12_4_ = auVar151._12_4_ * auVar103._12_4_;
          auVar103._16_4_ = auVar151._16_4_ * auVar103._16_4_;
          auVar103._20_4_ = auVar151._20_4_ * auVar103._20_4_;
          auVar103._24_4_ = auVar151._24_4_ * auVar103._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + lVar44 * 0x20) = auVar103;
        lVar44 = lVar44 + 1;
      } while (lVar44 != iVar51);
    }
    iVar26 = 0;
  }
LAB_003068c3:
  if ((int *)local_3b8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_3b8._8_8_ = *(int *)local_3b8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_3b8._8_8_ == 0) {
      if (local_398 == (Allocator *)0x0) {
        if ((void *)local_3b8._0_8_ != (void *)0x0) {
          free((void *)local_3b8._0_8_);
        }
      }
      else {
        (*local_398->_vptr_Allocator[3])();
      }
    }
  }
  return iVar26;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}